

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<4,8>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  void *pvVar6;
  __int_type_conflict _Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  int iVar46;
  uint uVar47;
  uint uVar48;
  ulong uVar49;
  long lVar51;
  byte bVar52;
  uint uVar53;
  ulong uVar54;
  uint uVar55;
  ulong uVar56;
  undefined4 uVar57;
  undefined8 in_R10;
  bool bVar58;
  ulong uVar59;
  float fVar60;
  float fVar61;
  float fVar86;
  float fVar88;
  vint4 bi_2;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar87;
  float fVar89;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar90;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined8 uVar91;
  vint4 bi_1;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar123;
  vint4 ai_2;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar138;
  float fVar147;
  vint4 ai;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar148;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  vint4 bi;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  float fVar165;
  float fVar166;
  float fVar184;
  float fVar185;
  vint4 ai_1;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar186;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar190 [16];
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar197;
  undefined1 auVar196 [32];
  float fVar201;
  float fVar212;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar213;
  float fVar228;
  vfloat4 a0_2;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar229;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  vfloat4 a0_3;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  vfloat4 a0_1;
  undefined1 auVar251 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar250 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  float fVar260;
  float fVar269;
  float fVar270;
  vfloat4 a0;
  float fVar271;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar274 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar285 [32];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_780 [8];
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined1 local_720 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined4 local_560;
  undefined4 local_550;
  uint auStack_520 [4];
  RTCFilterFunctionNArguments local_510;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar50;
  undefined1 auVar284 [32];
  
  PVar3 = prim[1];
  uVar49 = (ulong)(byte)PVar3;
  fVar60 = *(float *)(prim + uVar49 * 0x19 + 0x12);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar8 = vsubps_avx(auVar8,*(undefined1 (*) [16])(prim + uVar49 * 0x19 + 6));
  auVar62._0_4_ = fVar60 * auVar8._0_4_;
  auVar62._4_4_ = fVar60 * auVar8._4_4_;
  auVar62._8_4_ = fVar60 * auVar8._8_4_;
  auVar62._12_4_ = fVar60 * auVar8._12_4_;
  auVar149._0_4_ = fVar60 * auVar9._0_4_;
  auVar149._4_4_ = fVar60 * auVar9._4_4_;
  auVar149._8_4_ = fVar60 * auVar9._8_4_;
  auVar149._12_4_ = fVar60 * auVar9._12_4_;
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 4 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 5 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 6 + 6)));
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0xc + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0xd + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0x12 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0x13 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  auVar113 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar49 * 0x14 + 6)));
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar272._4_4_ = auVar149._0_4_;
  auVar272._0_4_ = auVar149._0_4_;
  auVar272._8_4_ = auVar149._0_4_;
  auVar272._12_4_ = auVar149._0_4_;
  auVar93 = vshufps_avx(auVar149,auVar149,0x55);
  auVar63 = vshufps_avx(auVar149,auVar149,0xaa);
  fVar60 = auVar63._0_4_;
  auVar230._0_4_ = fVar60 * auVar131._0_4_;
  fVar86 = auVar63._4_4_;
  auVar230._4_4_ = fVar86 * auVar131._4_4_;
  fVar88 = auVar63._8_4_;
  auVar230._8_4_ = fVar88 * auVar131._8_4_;
  fVar123 = auVar63._12_4_;
  auVar230._12_4_ = fVar123 * auVar131._12_4_;
  auVar214._0_4_ = auVar13._0_4_ * fVar60;
  auVar214._4_4_ = auVar13._4_4_ * fVar86;
  auVar214._8_4_ = auVar13._8_4_ * fVar88;
  auVar214._12_4_ = auVar13._12_4_ * fVar123;
  auVar244._0_4_ = auVar113._0_4_ * fVar60;
  auVar244._4_4_ = auVar113._4_4_ * fVar86;
  auVar244._8_4_ = auVar113._8_4_ * fVar88;
  auVar244._12_4_ = auVar113._12_4_ * fVar123;
  auVar63 = vfmadd231ps_fma(auVar230,auVar93,auVar9);
  auVar94 = vfmadd231ps_fma(auVar214,auVar93,auVar12);
  auVar93 = vfmadd231ps_fma(auVar244,auVar64,auVar93);
  auVar124 = vfmadd231ps_fma(auVar63,auVar272,auVar8);
  auVar94 = vfmadd231ps_fma(auVar94,auVar272,auVar11);
  auVar139 = vfmadd231ps_fma(auVar93,auVar65,auVar272);
  auVar273._4_4_ = auVar62._0_4_;
  auVar273._0_4_ = auVar62._0_4_;
  auVar273._8_4_ = auVar62._0_4_;
  auVar273._12_4_ = auVar62._0_4_;
  auVar93 = vshufps_avx(auVar62,auVar62,0x55);
  auVar63 = vshufps_avx(auVar62,auVar62,0xaa);
  fVar60 = auVar63._0_4_;
  auVar150._0_4_ = fVar60 * auVar131._0_4_;
  fVar86 = auVar63._4_4_;
  auVar150._4_4_ = fVar86 * auVar131._4_4_;
  fVar88 = auVar63._8_4_;
  auVar150._8_4_ = fVar88 * auVar131._8_4_;
  fVar123 = auVar63._12_4_;
  auVar150._12_4_ = fVar123 * auVar131._12_4_;
  auVar92._0_4_ = auVar13._0_4_ * fVar60;
  auVar92._4_4_ = auVar13._4_4_ * fVar86;
  auVar92._8_4_ = auVar13._8_4_ * fVar88;
  auVar92._12_4_ = auVar13._12_4_ * fVar123;
  auVar63._0_4_ = auVar113._0_4_ * fVar60;
  auVar63._4_4_ = auVar113._4_4_ * fVar86;
  auVar63._8_4_ = auVar113._8_4_ * fVar88;
  auVar63._12_4_ = auVar113._12_4_ * fVar123;
  auVar9 = vfmadd231ps_fma(auVar150,auVar93,auVar9);
  auVar131 = vfmadd231ps_fma(auVar92,auVar93,auVar12);
  auVar12 = vfmadd231ps_fma(auVar63,auVar93,auVar64);
  auVar13 = vfmadd231ps_fma(auVar9,auVar273,auVar8);
  auVar64 = vfmadd231ps_fma(auVar131,auVar273,auVar11);
  auVar242._8_4_ = 0x7fffffff;
  auVar242._0_8_ = 0x7fffffff7fffffff;
  auVar242._12_4_ = 0x7fffffff;
  auVar113 = vfmadd231ps_fma(auVar12,auVar273,auVar65);
  auVar8 = vandps_avx(auVar124,auVar242);
  auVar251._8_4_ = 0x219392ef;
  auVar251._0_8_ = 0x219392ef219392ef;
  auVar251._12_4_ = 0x219392ef;
  auVar8 = vcmpps_avx(auVar8,auVar251,1);
  auVar9 = vblendvps_avx(auVar124,auVar251,auVar8);
  auVar8 = vandps_avx(auVar94,auVar242);
  auVar8 = vcmpps_avx(auVar8,auVar251,1);
  auVar131 = vblendvps_avx(auVar94,auVar251,auVar8);
  auVar8 = vandps_avx(auVar242,auVar139);
  auVar8 = vcmpps_avx(auVar8,auVar251,1);
  auVar8 = vblendvps_avx(auVar139,auVar251,auVar8);
  auVar11 = vrcpps_avx(auVar9);
  auVar187._8_4_ = 0x3f800000;
  auVar187._0_8_ = 0x3f8000003f800000;
  auVar187._12_4_ = 0x3f800000;
  auVar9 = vfnmadd213ps_fma(auVar9,auVar11,auVar187);
  auVar11 = vfmadd132ps_fma(auVar9,auVar11,auVar11);
  auVar9 = vrcpps_avx(auVar131);
  auVar131 = vfnmadd213ps_fma(auVar131,auVar9,auVar187);
  auVar12 = vfmadd132ps_fma(auVar131,auVar9,auVar9);
  auVar9 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar9,auVar187);
  auVar65 = vfmadd132ps_fma(auVar8,auVar9,auVar9);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar49 * 7 + 6);
  auVar8 = vpmovsxwd_avx(auVar8);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar131 = vsubps_avx(auVar8,auVar13);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar49 * 9 + 6);
  auVar8 = vpmovsxwd_avx(auVar9);
  auVar139._0_4_ = auVar11._0_4_ * auVar131._0_4_;
  auVar139._4_4_ = auVar11._4_4_ * auVar131._4_4_;
  auVar139._8_4_ = auVar11._8_4_ * auVar131._8_4_;
  auVar139._12_4_ = auVar11._12_4_ * auVar131._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar13);
  auVar151._0_4_ = auVar11._0_4_ * auVar8._0_4_;
  auVar151._4_4_ = auVar11._4_4_ * auVar8._4_4_;
  auVar151._8_4_ = auVar11._8_4_ * auVar8._8_4_;
  auVar151._12_4_ = auVar11._12_4_ * auVar8._12_4_;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *(ulong *)(prim + uVar49 * 0xe + 6);
  auVar8 = vpmovsxwd_avx(auVar131);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vsubps_avx(auVar8,auVar64);
  auVar94._1_3_ = 0;
  auVar94[0] = PVar3;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar8 = vpmovsxwd_avx(auVar11);
  auVar167._0_4_ = auVar12._0_4_ * auVar9._0_4_;
  auVar167._4_4_ = auVar12._4_4_ * auVar9._4_4_;
  auVar167._8_4_ = auVar12._8_4_ * auVar9._8_4_;
  auVar167._12_4_ = auVar12._12_4_ * auVar9._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar64);
  auVar93._0_4_ = auVar12._0_4_ * auVar8._0_4_;
  auVar93._4_4_ = auVar12._4_4_ * auVar8._4_4_;
  auVar93._8_4_ = auVar12._8_4_ * auVar8._8_4_;
  auVar93._12_4_ = auVar12._12_4_ * auVar8._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar49 * 0x15 + 6);
  auVar8 = vpmovsxwd_avx(auVar12);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar113);
  auVar124._0_4_ = auVar65._0_4_ * auVar8._0_4_;
  auVar124._4_4_ = auVar65._4_4_ * auVar8._4_4_;
  auVar124._8_4_ = auVar65._8_4_ * auVar8._8_4_;
  auVar124._12_4_ = auVar65._12_4_ * auVar8._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar49 * 0x17 + 6);
  auVar8 = vpmovsxwd_avx(auVar13);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar113);
  auVar64._0_4_ = auVar65._0_4_ * auVar8._0_4_;
  auVar64._4_4_ = auVar65._4_4_ * auVar8._4_4_;
  auVar64._8_4_ = auVar65._8_4_ * auVar8._8_4_;
  auVar64._12_4_ = auVar65._12_4_ * auVar8._12_4_;
  auVar8 = vpminsd_avx(auVar139,auVar151);
  auVar9 = vpminsd_avx(auVar167,auVar93);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vpminsd_avx(auVar124,auVar64);
  uVar57 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar128._4_4_ = uVar57;
  auVar128._0_4_ = uVar57;
  auVar128._8_4_ = uVar57;
  auVar128._12_4_ = uVar57;
  auVar9 = vmaxps_avx(auVar9,auVar128);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  local_450._0_4_ = auVar8._0_4_ * 0.99999964;
  local_450._4_4_ = auVar8._4_4_ * 0.99999964;
  local_450._8_4_ = auVar8._8_4_ * 0.99999964;
  local_450._12_4_ = auVar8._12_4_ * 0.99999964;
  auVar8 = vpmaxsd_avx(auVar139,auVar151);
  auVar9 = vpmaxsd_avx(auVar167,auVar93);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar9 = vpmaxsd_avx(auVar124,auVar64);
  uVar57 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar113._4_4_ = uVar57;
  auVar113._0_4_ = uVar57;
  auVar113._8_4_ = uVar57;
  auVar113._12_4_ = uVar57;
  auVar9 = vminps_avx(auVar9,auVar113);
  auVar8 = vminps_avx(auVar8,auVar9);
  auVar65._0_4_ = auVar8._0_4_ * 1.0000004;
  auVar65._4_4_ = auVar8._4_4_ * 1.0000004;
  auVar65._8_4_ = auVar8._8_4_ * 1.0000004;
  auVar65._12_4_ = auVar8._12_4_ * 1.0000004;
  auVar94[4] = PVar3;
  auVar94._5_3_ = 0;
  auVar94[8] = PVar3;
  auVar94._9_3_ = 0;
  auVar94[0xc] = PVar3;
  auVar94._13_3_ = 0;
  auVar9 = vpcmpgtd_avx(auVar94,_DAT_01f4ad30);
  auVar8 = vcmpps_avx(local_450,auVar65,2);
  auVar8 = vandps_avx(auVar8,auVar9);
  uVar57 = vmovmskps_avx(auVar8);
  uVar49 = CONCAT44((int)((ulong)in_R10 >> 0x20),uVar57);
  auVar82._16_16_ = mm_lookupmask_ps._240_16_;
  auVar82._0_16_ = mm_lookupmask_ps._240_16_;
  local_300 = vblendps_avx(auVar82,ZEXT832(0) << 0x20,0x80);
  iVar46 = 1 << ((uint)k & 0x1f);
  auVar83._4_4_ = iVar46;
  auVar83._0_4_ = iVar46;
  auVar83._8_4_ = iVar46;
  auVar83._12_4_ = iVar46;
  auVar83._16_4_ = iVar46;
  auVar83._20_4_ = iVar46;
  auVar83._24_4_ = iVar46;
  auVar83._28_4_ = iVar46;
  auVar15 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar82 = vpand_avx2(auVar83,auVar15);
  local_360 = vpcmpeqd_avx2(auVar82,auVar15);
LAB_011378df:
  if (uVar49 == 0) {
LAB_01139584:
    return uVar49 != 0;
  }
  lVar51 = 0;
  for (uVar54 = uVar49; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    lVar51 = lVar51 + 1;
  }
  uVar48 = *(uint *)(prim + 2);
  local_340 = *(uint *)(prim + lVar51 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar48].ptr;
  uVar54 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_340);
  p_Var5 = pGVar4[1].intersectionFilterN;
  pvVar6 = pGVar4[2].userPtr;
  _Var7 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar13 = *(undefined1 (*) [16])(_Var7 + uVar54 * (long)pvVar6);
  auVar8 = *(undefined1 (*) [16])(_Var7 + (uVar54 + 1) * (long)pvVar6);
  auVar9 = *(undefined1 (*) [16])(_Var7 + (uVar54 + 2) * (long)pvVar6);
  pfVar1 = (float *)(_Var7 + (long)pvVar6 * (uVar54 + 3));
  fVar60 = *pfVar1;
  fVar86 = pfVar1[1];
  fVar88 = pfVar1[2];
  fVar123 = pfVar1[3];
  lVar51 = *(long *)&pGVar4[1].time_range.upper;
  auVar131 = *(undefined1 (*) [16])(lVar51 + (long)p_Var5 * uVar54);
  auVar11 = *(undefined1 (*) [16])(lVar51 + (long)p_Var5 * (uVar54 + 1));
  auVar12 = *(undefined1 (*) [16])(lVar51 + (long)p_Var5 * (uVar54 + 2));
  uVar59 = uVar49 - 1 & uVar49;
  pfVar1 = (float *)(lVar51 + (long)p_Var5 * (uVar54 + 3));
  fVar165 = *pfVar1;
  fVar184 = pfVar1[1];
  fVar185 = pfVar1[2];
  fVar186 = pfVar1[3];
  if (uVar59 != 0) {
    uVar56 = uVar59 - 1 & uVar59;
    for (uVar54 = uVar59; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    }
    if (uVar56 != 0) {
      for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar65 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar65 = vinsertps_avx(auVar65,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar95._0_4_ = fVar165 * 0.0;
  auVar95._4_4_ = fVar184 * 0.0;
  auVar95._8_4_ = fVar185 * 0.0;
  auVar95._12_4_ = fVar186 * 0.0;
  auVar274._8_4_ = 0x3e2aaaab;
  auVar274._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar274._12_4_ = 0x3e2aaaab;
  auVar64 = vfmadd213ps_fma(auVar274,auVar12,auVar95);
  auVar202._8_4_ = 0x3f2aaaab;
  auVar202._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar202._12_4_ = 0x3f2aaaab;
  auVar64 = vfmadd231ps_fma(auVar64,auVar11,auVar202);
  auVar113 = vfmadd231ps_fma(auVar64,auVar131,auVar274);
  auVar66._8_4_ = 0x3f000000;
  auVar66._0_8_ = 0x3f0000003f000000;
  auVar66._12_4_ = 0x3f000000;
  auVar64 = vfmadd231ps_fma(auVar95,auVar12,auVar66);
  auVar64 = vfnmadd231ps_fma(auVar64,auVar11,ZEXT816(0) << 0x40);
  auVar63 = vfnmadd231ps_fma(auVar64,auVar131,auVar66);
  auVar248._0_4_ = fVar60 * 0.0;
  auVar248._4_4_ = fVar86 * 0.0;
  auVar248._8_4_ = fVar88 * 0.0;
  auVar248._12_4_ = fVar123 * 0.0;
  auVar139 = ZEXT816(0) << 0x40;
  auVar64 = vfmadd213ps_fma(auVar274,auVar9,auVar248);
  auVar64 = vfmadd231ps_fma(auVar64,auVar8,auVar202);
  auVar64 = vfmadd231ps_fma(auVar64,auVar13,auVar274);
  auVar93 = vfmadd231ps_fma(auVar248,auVar9,auVar66);
  auVar93 = vfnmadd231ps_fma(auVar93,auVar8,auVar139);
  auVar94 = vfnmadd231ps_fma(auVar93,auVar13,auVar66);
  auVar125._0_4_ = fVar165 * 0.16666667;
  auVar125._4_4_ = fVar184 * 0.16666667;
  auVar125._8_4_ = fVar185 * 0.16666667;
  auVar125._12_4_ = fVar186 * 0.16666667;
  auVar93 = vfmadd231ps_fma(auVar125,auVar12,auVar202);
  auVar93 = vfmadd231ps_fma(auVar93,auVar11,auVar274);
  auVar93 = vfmadd231ps_fma(auVar93,auVar131,auVar139);
  auVar140._0_4_ = fVar165 * 0.5;
  auVar140._4_4_ = fVar184 * 0.5;
  auVar140._8_4_ = fVar185 * 0.5;
  auVar140._12_4_ = fVar186 * 0.5;
  auVar12 = vfmadd231ps_fma(auVar140,auVar139,auVar12);
  auVar11 = vfnmadd231ps_fma(auVar12,auVar66,auVar11);
  auVar124 = vfnmadd231ps_fma(auVar11,auVar139,auVar131);
  auVar215._0_4_ = fVar60 * 0.16666667;
  auVar215._4_4_ = fVar86 * 0.16666667;
  auVar215._8_4_ = fVar88 * 0.16666667;
  auVar215._12_4_ = fVar123 * 0.16666667;
  auVar114._8_4_ = 0x3f2aaaab;
  auVar114._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar114._12_4_ = 0x3f2aaaab;
  auVar131 = vfmadd231ps_fma(auVar215,auVar9,auVar114);
  auVar131 = vfmadd231ps_fma(auVar131,auVar8,auVar274);
  auVar12 = vfmadd231ps_fma(auVar131,auVar13,auVar139);
  auVar231._0_4_ = fVar60 * 0.5;
  auVar231._4_4_ = fVar86 * 0.5;
  auVar231._8_4_ = fVar88 * 0.5;
  auVar231._12_4_ = fVar123 * 0.5;
  auVar9 = vfmadd231ps_fma(auVar231,auVar139,auVar9);
  auVar8 = vfnmadd231ps_fma(auVar9,auVar66,auVar8);
  auVar13 = vfnmadd231ps_fma(auVar8,auVar139,auVar13);
  auVar8 = vshufps_avx(auVar63,auVar63,0xc9);
  auVar9 = vshufps_avx(auVar64,auVar64,0xc9);
  fVar87 = auVar63._0_4_;
  auVar168._0_4_ = fVar87 * auVar9._0_4_;
  fVar89 = auVar63._4_4_;
  auVar168._4_4_ = fVar89 * auVar9._4_4_;
  fVar166 = auVar63._8_4_;
  auVar168._8_4_ = fVar166 * auVar9._8_4_;
  fVar61 = auVar63._12_4_;
  auVar168._12_4_ = fVar61 * auVar9._12_4_;
  auVar9 = vfmsub231ps_fma(auVar168,auVar8,auVar64);
  auVar131 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar94,auVar94,0xc9);
  auVar169._0_4_ = fVar87 * auVar9._0_4_;
  auVar169._4_4_ = fVar89 * auVar9._4_4_;
  auVar169._8_4_ = fVar166 * auVar9._8_4_;
  auVar169._12_4_ = fVar61 * auVar9._12_4_;
  auVar8 = vfmsub231ps_fma(auVar169,auVar8,auVar94);
  auVar11 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar9 = vshufps_avx(auVar124,auVar124,0xc9);
  auVar8 = vshufps_avx(auVar12,auVar12,0xc9);
  fVar229 = auVar124._0_4_;
  auVar152._0_4_ = fVar229 * auVar8._0_4_;
  fVar138 = auVar124._4_4_;
  auVar152._4_4_ = fVar138 * auVar8._4_4_;
  fVar147 = auVar124._8_4_;
  auVar152._8_4_ = fVar147 * auVar8._8_4_;
  fVar148 = auVar124._12_4_;
  auVar152._12_4_ = fVar148 * auVar8._12_4_;
  auVar8 = vfmsub231ps_fma(auVar152,auVar9,auVar12);
  auVar12 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar188._0_4_ = fVar229 * auVar8._0_4_;
  auVar188._4_4_ = fVar138 * auVar8._4_4_;
  auVar188._8_4_ = fVar147 * auVar8._8_4_;
  auVar188._12_4_ = fVar148 * auVar8._12_4_;
  auVar8 = vdpps_avx(auVar131,auVar131,0x7f);
  auVar9 = vfmsub231ps_fma(auVar188,auVar9,auVar13);
  auVar13 = vshufps_avx(auVar9,auVar9,0xc9);
  fVar86 = auVar8._0_4_;
  auVar64 = ZEXT416((uint)fVar86);
  auVar9 = vrsqrtss_avx(auVar64,auVar64);
  fVar60 = auVar9._0_4_;
  fVar60 = fVar60 * 1.5 + fVar86 * -0.5 * fVar60 * fVar60 * fVar60;
  fVar165 = auVar131._0_4_ * fVar60;
  fVar184 = auVar131._4_4_ * fVar60;
  fVar185 = auVar131._8_4_ * fVar60;
  fVar186 = auVar131._12_4_ * fVar60;
  auVar9 = vdpps_avx(auVar131,auVar11,0x7f);
  auVar243._0_4_ = auVar11._0_4_ * fVar86;
  auVar243._4_4_ = auVar11._4_4_ * fVar86;
  auVar243._8_4_ = auVar11._8_4_ * fVar86;
  auVar243._12_4_ = auVar11._12_4_ * fVar86;
  fVar86 = auVar9._0_4_;
  auVar203._0_4_ = auVar131._0_4_ * fVar86;
  auVar203._4_4_ = auVar131._4_4_ * fVar86;
  auVar203._8_4_ = auVar131._8_4_ * fVar86;
  auVar203._12_4_ = auVar131._12_4_ * fVar86;
  auVar131 = vsubps_avx(auVar243,auVar203);
  auVar9 = vrcpss_avx(auVar64,auVar64);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar88 = auVar9._0_4_ * auVar8._0_4_;
  auVar8 = vdpps_avx(auVar12,auVar12,0x7f);
  fVar123 = auVar8._0_4_;
  auVar64 = ZEXT416((uint)fVar123);
  auVar9 = vrsqrtss_avx(auVar64,auVar64);
  fVar86 = auVar9._0_4_;
  fVar86 = fVar86 * 1.5 + fVar123 * -0.5 * fVar86 * fVar86 * fVar86;
  auVar9 = vdpps_avx(auVar12,auVar13,0x7f);
  fVar260 = fVar86 * auVar12._0_4_;
  fVar269 = fVar86 * auVar12._4_4_;
  fVar270 = fVar86 * auVar12._8_4_;
  fVar271 = fVar86 * auVar12._12_4_;
  auVar189._0_4_ = fVar123 * auVar13._0_4_;
  auVar189._4_4_ = fVar123 * auVar13._4_4_;
  auVar189._8_4_ = fVar123 * auVar13._8_4_;
  auVar189._12_4_ = fVar123 * auVar13._12_4_;
  fVar123 = auVar9._0_4_;
  auVar153._0_4_ = fVar123 * auVar12._0_4_;
  auVar153._4_4_ = fVar123 * auVar12._4_4_;
  auVar153._8_4_ = fVar123 * auVar12._8_4_;
  auVar153._12_4_ = fVar123 * auVar12._12_4_;
  auVar11 = vsubps_avx(auVar189,auVar153);
  auVar9 = vrcpss_avx(auVar64,auVar64);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar9,ZEXT416(0x40000000));
  fVar123 = auVar8._0_4_ * auVar9._0_4_;
  auVar8 = vshufps_avx(auVar113,auVar113,0xff);
  auVar216._0_4_ = auVar8._0_4_ * fVar165;
  auVar216._4_4_ = auVar8._4_4_ * fVar184;
  auVar216._8_4_ = auVar8._8_4_ * fVar185;
  auVar216._12_4_ = auVar8._12_4_ * fVar186;
  auVar64 = vsubps_avx(auVar113,auVar216);
  auVar9 = vshufps_avx(auVar63,auVar63,0xff);
  auVar170._0_4_ = auVar9._0_4_ * fVar165 + fVar60 * auVar131._0_4_ * fVar88 * auVar8._0_4_;
  auVar170._4_4_ = auVar9._4_4_ * fVar184 + fVar60 * auVar131._4_4_ * fVar88 * auVar8._4_4_;
  auVar170._8_4_ = auVar9._8_4_ * fVar185 + fVar60 * auVar131._8_4_ * fVar88 * auVar8._8_4_;
  auVar170._12_4_ = auVar9._12_4_ * fVar186 + fVar60 * auVar131._12_4_ * fVar88 * auVar8._12_4_;
  auVar131 = vsubps_avx(auVar63,auVar170);
  auVar232._0_4_ = auVar113._0_4_ + auVar216._0_4_;
  auVar232._4_4_ = auVar113._4_4_ + auVar216._4_4_;
  auVar232._8_4_ = auVar113._8_4_ + auVar216._8_4_;
  auVar232._12_4_ = auVar113._12_4_ + auVar216._12_4_;
  auVar8 = vshufps_avx(auVar93,auVar93,0xff);
  auVar115._0_4_ = fVar260 * auVar8._0_4_;
  auVar115._4_4_ = fVar269 * auVar8._4_4_;
  auVar115._8_4_ = fVar270 * auVar8._8_4_;
  auVar115._12_4_ = fVar271 * auVar8._12_4_;
  auVar113 = vsubps_avx(auVar93,auVar115);
  auVar9 = vshufps_avx(auVar124,auVar124,0xff);
  auVar96._0_4_ = fVar260 * auVar9._0_4_ + auVar8._0_4_ * fVar86 * auVar11._0_4_ * fVar123;
  auVar96._4_4_ = fVar269 * auVar9._4_4_ + auVar8._4_4_ * fVar86 * auVar11._4_4_ * fVar123;
  auVar96._8_4_ = fVar270 * auVar9._8_4_ + auVar8._8_4_ * fVar86 * auVar11._8_4_ * fVar123;
  auVar96._12_4_ = fVar271 * auVar9._12_4_ + auVar8._12_4_ * fVar86 * auVar11._12_4_ * fVar123;
  auVar8 = vsubps_avx(auVar124,auVar96);
  fVar165 = auVar93._0_4_ + auVar115._0_4_;
  fVar184 = auVar93._4_4_ + auVar115._4_4_;
  fVar185 = auVar93._8_4_ + auVar115._8_4_;
  fVar186 = auVar93._12_4_ + auVar115._12_4_;
  auVar126._0_4_ = auVar64._0_4_ + auVar131._0_4_ * 0.33333334;
  auVar126._4_4_ = auVar64._4_4_ + auVar131._4_4_ * 0.33333334;
  auVar126._8_4_ = auVar64._8_4_ + auVar131._8_4_ * 0.33333334;
  auVar126._12_4_ = auVar64._12_4_ + auVar131._12_4_ * 0.33333334;
  auVar97._0_4_ = auVar8._0_4_ * 0.33333334;
  auVar97._4_4_ = auVar8._4_4_ * 0.33333334;
  auVar97._8_4_ = auVar8._8_4_ * 0.33333334;
  auVar97._12_4_ = auVar8._12_4_ * 0.33333334;
  auVar93 = vsubps_avx(auVar113,auVar97);
  auVar63 = vsubps_avx(auVar64,auVar65);
  auVar8 = vshufps_avx(auVar63,auVar63,0x55);
  auVar9 = vshufps_avx(auVar63,auVar63,0xaa);
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar60 = pre->ray_space[k].vz.field_0.m128[0];
  fVar86 = pre->ray_space[k].vz.field_0.m128[1];
  fVar88 = pre->ray_space[k].vz.field_0.m128[2];
  fVar123 = pre->ray_space[k].vz.field_0.m128[3];
  auVar98._0_4_ = fVar60 * auVar9._0_4_;
  auVar98._4_4_ = fVar86 * auVar9._4_4_;
  auVar98._8_4_ = fVar88 * auVar9._8_4_;
  auVar98._12_4_ = fVar123 * auVar9._12_4_;
  auVar131 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar2,auVar8);
  auVar94 = vsubps_avx(auVar126,auVar65);
  auVar8 = vshufps_avx(auVar94,auVar94,0x55);
  auVar9 = vshufps_avx(auVar94,auVar94,0xaa);
  auVar280._0_4_ = fVar60 * auVar9._0_4_;
  auVar280._4_4_ = fVar86 * auVar9._4_4_;
  auVar280._8_4_ = fVar88 * auVar9._8_4_;
  auVar280._12_4_ = fVar123 * auVar9._12_4_;
  auVar9 = vfmadd231ps_fma(auVar280,(undefined1  [16])aVar2,auVar8);
  local_3e0 = vsubps_avx(auVar93,auVar65);
  auVar8 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar249._0_4_ = fVar60 * auVar8._0_4_;
  auVar249._4_4_ = fVar86 * auVar8._4_4_;
  auVar249._8_4_ = fVar88 * auVar8._8_4_;
  auVar249._12_4_ = fVar123 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_3e0,local_3e0,0x55);
  auVar11 = vfmadd231ps_fma(auVar249,(undefined1  [16])aVar2,auVar8);
  local_3f0 = vsubps_avx(auVar113,auVar65);
  auVar8 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar261._0_4_ = fVar60 * auVar8._0_4_;
  auVar261._4_4_ = fVar86 * auVar8._4_4_;
  auVar261._8_4_ = fVar88 * auVar8._8_4_;
  auVar261._12_4_ = fVar123 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar12 = vfmadd231ps_fma(auVar261,(undefined1  [16])aVar2,auVar8);
  local_400 = vsubps_avx(auVar232,auVar65);
  auVar8 = vshufps_avx(local_400,local_400,0xaa);
  auVar154._0_4_ = fVar60 * auVar8._0_4_;
  auVar154._4_4_ = fVar86 * auVar8._4_4_;
  auVar154._8_4_ = fVar88 * auVar8._8_4_;
  auVar154._12_4_ = fVar123 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_400,local_400,0x55);
  auVar13 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar2,auVar8);
  auVar67._0_4_ = (fVar87 + auVar170._0_4_) * 0.33333334 + auVar232._0_4_;
  auVar67._4_4_ = (fVar89 + auVar170._4_4_) * 0.33333334 + auVar232._4_4_;
  auVar67._8_4_ = (fVar166 + auVar170._8_4_) * 0.33333334 + auVar232._8_4_;
  auVar67._12_4_ = (fVar61 + auVar170._12_4_) * 0.33333334 + auVar232._12_4_;
  local_410 = vsubps_avx(auVar67,auVar65);
  auVar8 = vshufps_avx(local_410,local_410,0xaa);
  auVar204._0_4_ = auVar8._0_4_ * fVar60;
  auVar204._4_4_ = auVar8._4_4_ * fVar86;
  auVar204._8_4_ = auVar8._8_4_ * fVar88;
  auVar204._12_4_ = auVar8._12_4_ * fVar123;
  auVar8 = vshufps_avx(local_410,local_410,0x55);
  auVar139 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar2,auVar8);
  auVar217._0_4_ = (fVar229 + auVar96._0_4_) * 0.33333334;
  auVar217._4_4_ = (fVar138 + auVar96._4_4_) * 0.33333334;
  auVar217._8_4_ = (fVar147 + auVar96._8_4_) * 0.33333334;
  auVar217._12_4_ = (fVar148 + auVar96._12_4_) * 0.33333334;
  auVar20._4_4_ = fVar184;
  auVar20._0_4_ = fVar165;
  auVar20._8_4_ = fVar185;
  auVar20._12_4_ = fVar186;
  auVar124 = vsubps_avx(auVar20,auVar217);
  local_420 = vsubps_avx(auVar124,auVar65);
  auVar8 = vshufps_avx(local_420,local_420,0xaa);
  auVar218._0_4_ = auVar8._0_4_ * fVar60;
  auVar218._4_4_ = auVar8._4_4_ * fVar86;
  auVar218._8_4_ = auVar8._8_4_ * fVar88;
  auVar218._12_4_ = auVar8._12_4_ * fVar123;
  auVar8 = vshufps_avx(local_420,local_420,0x55);
  auVar62 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar2,auVar8);
  local_430 = vsubps_avx(auVar20,auVar65);
  auVar8 = vshufps_avx(local_430,local_430,0xaa);
  auVar68._0_4_ = fVar60 * auVar8._0_4_;
  auVar68._4_4_ = fVar86 * auVar8._4_4_;
  auVar68._8_4_ = fVar88 * auVar8._8_4_;
  auVar68._12_4_ = fVar123 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_430,local_430,0x55);
  auVar8 = vfmadd231ps_fma(auVar68,(undefined1  [16])aVar2,auVar8);
  local_550 = auVar63._0_4_;
  auVar171._4_4_ = local_550;
  auVar171._0_4_ = local_550;
  auVar171._8_4_ = local_550;
  auVar171._12_4_ = local_550;
  aVar2 = pre->ray_space[k].vx.field_0;
  auVar65 = vfmadd231ps_fma(auVar131,(undefined1  [16])aVar2,auVar171);
  local_560 = auVar94._0_4_;
  auVar172._4_4_ = local_560;
  auVar172._0_4_ = local_560;
  auVar172._8_4_ = local_560;
  auVar172._12_4_ = local_560;
  auVar92 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar172);
  uVar57 = local_3e0._0_4_;
  auVar173._4_4_ = uVar57;
  auVar173._0_4_ = uVar57;
  auVar173._8_4_ = uVar57;
  auVar173._12_4_ = uVar57;
  auVar251 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar2,auVar173);
  uVar57 = local_3f0._0_4_;
  auVar174._4_4_ = uVar57;
  auVar174._0_4_ = uVar57;
  auVar174._8_4_ = uVar57;
  auVar174._12_4_ = uVar57;
  auVar149 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar174);
  uVar57 = local_400._0_4_;
  auVar175._4_4_ = uVar57;
  auVar175._0_4_ = uVar57;
  auVar175._8_4_ = uVar57;
  auVar175._12_4_ = uVar57;
  auVar150 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar2,auVar175);
  uVar57 = local_410._0_4_;
  auVar176._4_4_ = uVar57;
  auVar176._0_4_ = uVar57;
  auVar176._8_4_ = uVar57;
  auVar176._12_4_ = uVar57;
  auVar139 = vfmadd231ps_fma(auVar139,(undefined1  [16])aVar2,auVar176);
  uVar57 = local_420._0_4_;
  auVar177._4_4_ = uVar57;
  auVar177._0_4_ = uVar57;
  auVar177._8_4_ = uVar57;
  auVar177._12_4_ = uVar57;
  auVar62 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar2,auVar177);
  uVar57 = local_430._0_4_;
  auVar178._4_4_ = uVar57;
  auVar178._0_4_ = uVar57;
  auVar178._8_4_ = uVar57;
  auVar178._12_4_ = uVar57;
  auVar151 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar2,auVar178);
  auVar11 = vmovlhps_avx(auVar65,auVar150);
  auVar12 = vmovlhps_avx(auVar92,auVar139);
  auVar13 = vmovlhps_avx(auVar251,auVar62);
  _local_3c0 = vmovlhps_avx(auVar149,auVar151);
  auVar8 = vminps_avx(auVar11,auVar12);
  auVar9 = vminps_avx(auVar13,_local_3c0);
  auVar131 = vminps_avx(auVar8,auVar9);
  auVar8 = vmaxps_avx(auVar11,auVar12);
  auVar9 = vmaxps_avx(auVar13,_local_3c0);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vshufpd_avx(auVar131,auVar131,3);
  auVar131 = vminps_avx(auVar131,auVar9);
  auVar9 = vshufpd_avx(auVar8,auVar8,3);
  auVar9 = vmaxps_avx(auVar8,auVar9);
  auVar8 = vandps_avx(auVar242,auVar131);
  auVar9 = vandps_avx(auVar242,auVar9);
  auVar8 = vmaxps_avx(auVar8,auVar9);
  auVar9 = vmovshdup_avx(auVar8);
  auVar8 = vmaxss_avx(auVar9,auVar8);
  local_1c0 = auVar8._0_4_ * 9.536743e-07;
  auVar190._8_8_ = auVar65._0_8_;
  auVar190._0_8_ = auVar65._0_8_;
  auVar233._8_8_ = auVar92._0_8_;
  auVar233._0_8_ = auVar92._0_8_;
  auVar250._0_8_ = auVar251._0_8_;
  auVar250._8_8_ = auVar250._0_8_;
  auVar262._0_8_ = auVar149._0_8_;
  auVar262._8_8_ = auVar262._0_8_;
  local_3d0 = ZEXT416((uint)local_1c0);
  fStack_1bc = local_1c0;
  fStack_1b8 = local_1c0;
  fStack_1b4 = local_1c0;
  fStack_1b0 = local_1c0;
  fStack_1ac = local_1c0;
  fStack_1a8 = local_1c0;
  fStack_1a4 = local_1c0;
  fStack_1d8 = -local_1c0;
  local_1e0 = -local_1c0;
  fStack_1dc = -local_1c0;
  fStack_1d4 = fStack_1d8;
  fStack_1d0 = fStack_1d8;
  fStack_1cc = fStack_1d8;
  fStack_1c8 = fStack_1d8;
  fStack_1c4 = fStack_1d8;
  local_320 = uVar48;
  uStack_31c = uVar48;
  uStack_318 = uVar48;
  uStack_314 = uVar48;
  uStack_310 = uVar48;
  uStack_30c = uVar48;
  uStack_308 = uVar48;
  uStack_304 = uVar48;
  uStack_33c = local_340;
  uStack_338 = local_340;
  uStack_334 = local_340;
  uStack_330 = local_340;
  uStack_32c = local_340;
  uStack_328 = local_340;
  uStack_324 = local_340;
  bVar58 = false;
  uVar54 = 0;
  fVar60 = *(float *)(ray + k * 4 + 0x60);
  local_390 = vsubps_avx(auVar12,auVar11);
  local_3a0 = vsubps_avx(auVar13,auVar12);
  local_3b0 = vsubps_avx(_local_3c0,auVar13);
  local_460 = vsubps_avx(auVar232,auVar64);
  local_470 = vsubps_avx(auVar67,auVar126);
  local_480 = vsubps_avx(auVar124,auVar93);
  auVar21._4_4_ = fVar184;
  auVar21._0_4_ = fVar165;
  auVar21._8_4_ = fVar185;
  auVar21._12_4_ = fVar186;
  _local_490 = vsubps_avx(auVar21,auVar113);
  auVar69 = ZEXT816(0x3f80000000000000);
  local_440 = auVar69;
LAB_011380f7:
  auVar8 = vshufps_avx(auVar69,auVar69,0x50);
  auVar281._8_4_ = 0x3f800000;
  auVar281._0_8_ = 0x3f8000003f800000;
  auVar281._12_4_ = 0x3f800000;
  auVar284._16_4_ = 0x3f800000;
  auVar284._0_16_ = auVar281;
  auVar284._20_4_ = 0x3f800000;
  auVar284._24_4_ = 0x3f800000;
  auVar284._28_4_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar281,auVar8);
  fVar86 = auVar8._0_4_;
  fVar138 = auVar150._0_4_;
  auVar70._0_4_ = fVar138 * fVar86;
  fVar88 = auVar8._4_4_;
  fVar147 = auVar150._4_4_;
  auVar70._4_4_ = fVar147 * fVar88;
  fVar123 = auVar8._8_4_;
  auVar70._8_4_ = fVar138 * fVar123;
  fVar87 = auVar8._12_4_;
  auVar70._12_4_ = fVar147 * fVar87;
  fVar148 = auVar139._0_4_;
  auVar179._0_4_ = fVar148 * fVar86;
  fVar260 = auVar139._4_4_;
  auVar179._4_4_ = fVar260 * fVar88;
  auVar179._8_4_ = fVar148 * fVar123;
  auVar179._12_4_ = fVar260 * fVar87;
  fVar201 = auVar62._0_4_;
  auVar141._0_4_ = fVar201 * fVar86;
  fVar212 = auVar62._4_4_;
  auVar141._4_4_ = fVar212 * fVar88;
  auVar141._8_4_ = fVar201 * fVar123;
  auVar141._12_4_ = fVar212 * fVar87;
  fVar213 = auVar151._0_4_;
  auVar116._0_4_ = fVar213 * fVar86;
  fVar228 = auVar151._4_4_;
  auVar116._4_4_ = fVar228 * fVar88;
  auVar116._8_4_ = fVar213 * fVar123;
  auVar116._12_4_ = fVar228 * fVar87;
  auVar92 = vfmadd231ps_fma(auVar70,auVar9,auVar190);
  auVar251 = vfmadd231ps_fma(auVar179,auVar9,auVar233);
  auVar149 = vfmadd231ps_fma(auVar141,auVar9,auVar250);
  auVar167 = vfmadd231ps_fma(auVar116,auVar262,auVar9);
  auVar8 = vmovshdup_avx(local_440);
  fVar86 = local_440._0_4_;
  fStack_288 = (auVar8._0_4_ - fVar86) * 0.04761905;
  auVar226._4_4_ = fVar86;
  auVar226._0_4_ = fVar86;
  auVar226._8_4_ = fVar86;
  auVar226._12_4_ = fVar86;
  auVar226._16_4_ = fVar86;
  auVar226._20_4_ = fVar86;
  auVar226._24_4_ = fVar86;
  auVar226._28_4_ = fVar86;
  auVar108._0_8_ = auVar8._0_8_;
  auVar108._8_8_ = auVar108._0_8_;
  auVar108._16_8_ = auVar108._0_8_;
  auVar108._24_8_ = auVar108._0_8_;
  auVar82 = vsubps_avx(auVar108,auVar226);
  uVar57 = auVar92._0_4_;
  auVar278._4_4_ = uVar57;
  auVar278._0_4_ = uVar57;
  auVar278._8_4_ = uVar57;
  auVar278._12_4_ = uVar57;
  auVar278._16_4_ = uVar57;
  auVar278._20_4_ = uVar57;
  auVar278._24_4_ = uVar57;
  auVar278._28_4_ = uVar57;
  auVar8 = vmovshdup_avx(auVar92);
  uVar91 = auVar8._0_8_;
  auVar268._8_8_ = uVar91;
  auVar268._0_8_ = uVar91;
  auVar268._16_8_ = uVar91;
  auVar268._24_8_ = uVar91;
  fVar269 = auVar251._0_4_;
  auVar257._4_4_ = fVar269;
  auVar257._0_4_ = fVar269;
  auVar257._8_4_ = fVar269;
  auVar257._12_4_ = fVar269;
  auVar257._16_4_ = fVar269;
  auVar257._20_4_ = fVar269;
  auVar257._24_4_ = fVar269;
  auVar257._28_4_ = fVar269;
  auVar9 = vmovshdup_avx(auVar251);
  auVar109._0_8_ = auVar9._0_8_;
  auVar109._8_8_ = auVar109._0_8_;
  auVar109._16_8_ = auVar109._0_8_;
  auVar109._24_8_ = auVar109._0_8_;
  fVar229 = auVar149._0_4_;
  auVar194._4_4_ = fVar229;
  auVar194._0_4_ = fVar229;
  auVar194._8_4_ = fVar229;
  auVar194._12_4_ = fVar229;
  auVar194._16_4_ = fVar229;
  auVar194._20_4_ = fVar229;
  auVar194._24_4_ = fVar229;
  auVar194._28_4_ = fVar229;
  auVar131 = vmovshdup_avx(auVar149);
  auVar210._0_8_ = auVar131._0_8_;
  auVar210._8_8_ = auVar210._0_8_;
  auVar210._16_8_ = auVar210._0_8_;
  auVar210._24_8_ = auVar210._0_8_;
  fVar61 = auVar167._0_4_;
  auVar65 = vmovshdup_avx(auVar167);
  auVar244 = vfmadd132ps_fma(auVar82,auVar226,_DAT_01f7b040);
  auVar82 = vsubps_avx(auVar284,ZEXT1632(auVar244));
  fVar86 = auVar244._0_4_;
  fVar88 = auVar244._4_4_;
  auVar15._4_4_ = fVar269 * fVar88;
  auVar15._0_4_ = fVar269 * fVar86;
  fVar123 = auVar244._8_4_;
  auVar15._8_4_ = fVar269 * fVar123;
  fVar87 = auVar244._12_4_;
  auVar15._12_4_ = fVar269 * fVar87;
  auVar15._16_4_ = fVar269 * 0.0;
  auVar15._20_4_ = fVar269 * 0.0;
  auVar15._24_4_ = fVar269 * 0.0;
  auVar15._28_4_ = 0x3f800000;
  auVar244 = vfmadd231ps_fma(auVar15,auVar82,auVar278);
  fVar89 = auVar9._0_4_;
  fVar166 = auVar9._4_4_;
  auVar14._4_4_ = fVar166 * fVar88;
  auVar14._0_4_ = fVar89 * fVar86;
  auVar14._8_4_ = fVar89 * fVar123;
  auVar14._12_4_ = fVar166 * fVar87;
  auVar14._16_4_ = fVar89 * 0.0;
  auVar14._20_4_ = fVar166 * 0.0;
  auVar14._24_4_ = fVar89 * 0.0;
  auVar14._28_4_ = uVar57;
  auVar187 = vfmadd231ps_fma(auVar14,auVar82,auVar268);
  auVar10._4_4_ = fVar229 * fVar88;
  auVar10._0_4_ = fVar229 * fVar86;
  auVar10._8_4_ = fVar229 * fVar123;
  auVar10._12_4_ = fVar229 * fVar87;
  auVar10._16_4_ = fVar229 * 0.0;
  auVar10._20_4_ = fVar229 * 0.0;
  auVar10._24_4_ = fVar229 * 0.0;
  auVar10._28_4_ = auVar8._4_4_;
  auVar214 = vfmadd231ps_fma(auVar10,auVar82,auVar257);
  fVar89 = auVar131._0_4_;
  fVar166 = auVar131._4_4_;
  auVar16._4_4_ = fVar166 * fVar88;
  auVar16._0_4_ = fVar89 * fVar86;
  auVar16._8_4_ = fVar89 * fVar123;
  auVar16._12_4_ = fVar166 * fVar87;
  auVar16._16_4_ = fVar89 * 0.0;
  auVar16._20_4_ = fVar166 * 0.0;
  auVar16._24_4_ = fVar89 * 0.0;
  auVar16._28_4_ = fVar269;
  auVar128 = vfmadd231ps_fma(auVar16,auVar82,auVar109);
  auVar8 = vshufps_avx(auVar92,auVar92,0xaa);
  local_720._8_8_ = auVar8._0_8_;
  local_720._0_8_ = local_720._8_8_;
  local_720._16_8_ = local_720._8_8_;
  local_720._24_8_ = local_720._8_8_;
  auVar9 = vshufps_avx(auVar92,auVar92,0xff);
  uStack_778 = auVar9._0_8_;
  local_780 = (undefined1  [8])uStack_778;
  uStack_770 = uStack_778;
  uStack_768 = uStack_778;
  auVar17._4_4_ = fVar61 * fVar88;
  auVar17._0_4_ = fVar61 * fVar86;
  auVar17._8_4_ = fVar61 * fVar123;
  auVar17._12_4_ = fVar61 * fVar87;
  auVar17._16_4_ = fVar61 * 0.0;
  auVar17._20_4_ = fVar61 * 0.0;
  auVar17._24_4_ = fVar61 * 0.0;
  auVar17._28_4_ = fVar61;
  auVar92 = vfmadd231ps_fma(auVar17,auVar82,auVar194);
  auVar9 = vshufps_avx(auVar251,auVar251,0xaa);
  auVar195._0_8_ = auVar9._0_8_;
  auVar195._8_8_ = auVar195._0_8_;
  auVar195._16_8_ = auVar195._0_8_;
  auVar195._24_8_ = auVar195._0_8_;
  auVar131 = vshufps_avx(auVar251,auVar251,0xff);
  local_620._8_8_ = auVar131._0_8_;
  local_620._0_8_ = local_620._8_8_;
  local_620._16_8_ = local_620._8_8_;
  local_620._24_8_ = local_620._8_8_;
  fVar89 = auVar65._0_4_;
  fVar166 = auVar65._4_4_;
  auVar18._4_4_ = fVar166 * fVar88;
  auVar18._0_4_ = fVar89 * fVar86;
  auVar18._8_4_ = fVar89 * fVar123;
  auVar18._12_4_ = fVar166 * fVar87;
  auVar18._16_4_ = fVar89 * 0.0;
  auVar18._20_4_ = fVar166 * 0.0;
  auVar18._24_4_ = fVar89 * 0.0;
  auVar18._28_4_ = auVar8._4_4_;
  auVar230 = vfmadd231ps_fma(auVar18,auVar82,auVar210);
  auVar19._28_4_ = fVar166;
  auVar19._0_28_ =
       ZEXT1628(CONCAT412(auVar214._12_4_ * fVar87,
                          CONCAT48(auVar214._8_4_ * fVar123,
                                   CONCAT44(auVar214._4_4_ * fVar88,auVar214._0_4_ * fVar86))));
  auVar244 = vfmadd231ps_fma(auVar19,auVar82,ZEXT1632(auVar244));
  fVar89 = auVar131._4_4_;
  auVar259._28_4_ = fVar89;
  auVar259._0_28_ =
       ZEXT1628(CONCAT412(auVar128._12_4_ * fVar87,
                          CONCAT48(auVar128._8_4_ * fVar123,
                                   CONCAT44(auVar128._4_4_ * fVar88,auVar128._0_4_ * fVar86))));
  auVar187 = vfmadd231ps_fma(auVar259,auVar82,ZEXT1632(auVar187));
  auVar8 = vshufps_avx(auVar149,auVar149,0xaa);
  uVar91 = auVar8._0_8_;
  auVar183._8_8_ = uVar91;
  auVar183._0_8_ = uVar91;
  auVar183._16_8_ = uVar91;
  auVar183._24_8_ = uVar91;
  auVar65 = vshufps_avx(auVar149,auVar149,0xff);
  uVar91 = auVar65._0_8_;
  auVar285._8_8_ = uVar91;
  auVar285._0_8_ = uVar91;
  auVar285._16_8_ = uVar91;
  auVar285._24_8_ = uVar91;
  auVar149 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar92._12_4_ * fVar87,
                                                CONCAT48(auVar92._8_4_ * fVar123,
                                                         CONCAT44(auVar92._4_4_ * fVar88,
                                                                  auVar92._0_4_ * fVar86)))),auVar82
                             ,ZEXT1632(auVar214));
  auVar92 = vshufps_avx(auVar167,auVar167,0xaa);
  auVar251 = vshufps_avx(auVar167,auVar167,0xff);
  auVar167 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar230._12_4_,
                                                CONCAT48(fVar123 * auVar230._8_4_,
                                                         CONCAT44(fVar88 * auVar230._4_4_,
                                                                  fVar86 * auVar230._0_4_)))),
                             auVar82,ZEXT1632(auVar128));
  auVar214 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar149._12_4_,
                                                CONCAT48(fVar123 * auVar149._8_4_,
                                                         CONCAT44(fVar88 * auVar149._4_4_,
                                                                  fVar86 * auVar149._0_4_)))),
                             auVar82,ZEXT1632(auVar244));
  auVar15 = vsubps_avx(ZEXT1632(auVar149),ZEXT1632(auVar244));
  auVar149 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar167._12_4_,
                                                CONCAT48(fVar123 * auVar167._8_4_,
                                                         CONCAT44(fVar88 * auVar167._4_4_,
                                                                  fVar86 * auVar167._0_4_)))),
                             auVar82,ZEXT1632(auVar187));
  auVar83 = vsubps_avx(ZEXT1632(auVar167),ZEXT1632(auVar187));
  fStack_5e4 = auVar83._28_4_;
  auVar258._0_4_ = fStack_288 * auVar15._0_4_ * 3.0;
  auVar258._4_4_ = fStack_288 * auVar15._4_4_ * 3.0;
  auVar258._8_4_ = fStack_288 * auVar15._8_4_ * 3.0;
  auVar258._12_4_ = fStack_288 * auVar15._12_4_ * 3.0;
  auVar258._16_4_ = fStack_288 * auVar15._16_4_ * 3.0;
  auVar258._20_4_ = fStack_288 * auVar15._20_4_ * 3.0;
  auVar258._24_4_ = fStack_288 * auVar15._24_4_ * 3.0;
  auVar258._28_4_ = 0;
  local_600._0_4_ = fStack_288 * auVar83._0_4_ * 3.0;
  local_600._4_4_ = fStack_288 * auVar83._4_4_ * 3.0;
  fStack_5f8 = fStack_288 * auVar83._8_4_ * 3.0;
  fStack_5f4 = fStack_288 * auVar83._12_4_ * 3.0;
  fStack_5f0 = fStack_288 * auVar83._16_4_ * 3.0;
  fStack_5ec = fStack_288 * auVar83._20_4_ * 3.0;
  fStack_5e8 = fStack_288 * auVar83._24_4_ * 3.0;
  fVar166 = auVar9._0_4_;
  fVar61 = auVar9._4_4_;
  auVar22._4_4_ = fVar61 * fVar88;
  auVar22._0_4_ = fVar166 * fVar86;
  auVar22._8_4_ = fVar166 * fVar123;
  auVar22._12_4_ = fVar61 * fVar87;
  auVar22._16_4_ = fVar166 * 0.0;
  auVar22._20_4_ = fVar61 * 0.0;
  auVar22._24_4_ = fVar166 * 0.0;
  auVar22._28_4_ = fStack_5e4;
  auVar9 = vfmadd231ps_fma(auVar22,auVar82,local_720);
  fVar166 = auVar131._0_4_;
  auVar23._4_4_ = fVar89 * fVar88;
  auVar23._0_4_ = fVar166 * fVar86;
  auVar23._8_4_ = fVar166 * fVar123;
  auVar23._12_4_ = fVar89 * fVar87;
  auVar23._16_4_ = fVar166 * 0.0;
  auVar23._20_4_ = fVar89 * 0.0;
  auVar23._24_4_ = fVar166 * 0.0;
  auVar23._28_4_ = 0;
  auVar131 = vfmadd231ps_fma(auVar23,auVar82,_local_780);
  fVar89 = auVar8._0_4_;
  fVar166 = auVar8._4_4_;
  auVar24._4_4_ = fVar166 * fVar88;
  auVar24._0_4_ = fVar89 * fVar86;
  auVar24._8_4_ = fVar89 * fVar123;
  auVar24._12_4_ = fVar166 * fVar87;
  auVar24._16_4_ = fVar89 * 0.0;
  auVar24._20_4_ = fVar166 * 0.0;
  auVar24._24_4_ = fVar89 * 0.0;
  auVar24._28_4_ = auVar15._28_4_;
  auVar8 = vfmadd231ps_fma(auVar24,auVar82,auVar195);
  fVar89 = auVar65._0_4_;
  fVar229 = auVar65._4_4_;
  auVar25._4_4_ = fVar229 * fVar88;
  auVar25._0_4_ = fVar89 * fVar86;
  auVar25._8_4_ = fVar89 * fVar123;
  auVar25._12_4_ = fVar229 * fVar87;
  auVar25._16_4_ = fVar89 * 0.0;
  auVar25._20_4_ = fVar229 * 0.0;
  auVar25._24_4_ = fVar89 * 0.0;
  auVar25._28_4_ = fVar61;
  auVar65 = vfmadd231ps_fma(auVar25,auVar82,local_620);
  auVar16 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar214));
  fVar89 = auVar92._0_4_;
  fVar166 = auVar92._4_4_;
  auVar26._4_4_ = fVar166 * fVar88;
  auVar26._0_4_ = fVar89 * fVar86;
  auVar26._8_4_ = fVar89 * fVar123;
  auVar26._12_4_ = fVar166 * fVar87;
  auVar26._16_4_ = fVar89 * 0.0;
  auVar26._20_4_ = fVar166 * 0.0;
  auVar26._24_4_ = fVar89 * 0.0;
  auVar26._28_4_ = fVar166;
  auVar92 = vfmadd231ps_fma(auVar26,auVar82,auVar183);
  auVar17 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar149));
  fVar89 = auVar251._0_4_;
  fVar166 = auVar251._4_4_;
  auVar27._4_4_ = fVar166 * fVar88;
  auVar27._0_4_ = fVar89 * fVar86;
  auVar27._8_4_ = fVar89 * fVar123;
  auVar27._12_4_ = fVar166 * fVar87;
  auVar27._16_4_ = fVar89 * 0.0;
  auVar27._20_4_ = fVar166 * 0.0;
  auVar27._24_4_ = fVar89 * 0.0;
  auVar27._28_4_ = fVar166;
  auVar251 = vfmadd231ps_fma(auVar27,auVar82,auVar285);
  auVar28._28_4_ = fVar229;
  auVar28._0_28_ =
       ZEXT1628(CONCAT412(auVar8._12_4_ * fVar87,
                          CONCAT48(auVar8._8_4_ * fVar123,
                                   CONCAT44(auVar8._4_4_ * fVar88,auVar8._0_4_ * fVar86))));
  auVar9 = vfmadd231ps_fma(auVar28,auVar82,ZEXT1632(auVar9));
  auVar131 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar65._12_4_,
                                                CONCAT48(fVar123 * auVar65._8_4_,
                                                         CONCAT44(fVar88 * auVar65._4_4_,
                                                                  fVar86 * auVar65._0_4_)))),auVar82
                             ,ZEXT1632(auVar131));
  auVar110._0_4_ = auVar214._0_4_ + auVar258._0_4_;
  auVar110._4_4_ = auVar214._4_4_ + auVar258._4_4_;
  auVar110._8_4_ = auVar214._8_4_ + auVar258._8_4_;
  auVar110._12_4_ = auVar214._12_4_ + auVar258._12_4_;
  auVar110._16_4_ = auVar258._16_4_ + 0.0;
  auVar110._20_4_ = auVar258._20_4_ + 0.0;
  auVar110._24_4_ = auVar258._24_4_ + 0.0;
  auVar110._28_4_ = 0;
  auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar92._12_4_ * fVar87,
                                              CONCAT48(auVar92._8_4_ * fVar123,
                                                       CONCAT44(auVar92._4_4_ * fVar88,
                                                                auVar92._0_4_ * fVar86)))),auVar82,
                           ZEXT1632(auVar8));
  auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar251._12_4_ * fVar87,
                                               CONCAT48(auVar251._8_4_ * fVar123,
                                                        CONCAT44(auVar251._4_4_ * fVar88,
                                                                 auVar251._0_4_ * fVar86)))),auVar82
                            ,ZEXT1632(auVar65));
  auVar92 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar8._12_4_,
                                               CONCAT48(fVar123 * auVar8._8_4_,
                                                        CONCAT44(fVar88 * auVar8._4_4_,
                                                                 fVar86 * auVar8._0_4_)))),auVar82,
                            ZEXT1632(auVar9));
  auVar251 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar65._12_4_ * fVar87,
                                                CONCAT48(auVar65._8_4_ * fVar123,
                                                         CONCAT44(auVar65._4_4_ * fVar88,
                                                                  auVar65._0_4_ * fVar86)))),
                             ZEXT1632(auVar131),auVar82);
  auVar82 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar15 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar131));
  auVar279._0_4_ = fStack_288 * auVar82._0_4_ * 3.0;
  auVar279._4_4_ = fStack_288 * auVar82._4_4_ * 3.0;
  auVar279._8_4_ = fStack_288 * auVar82._8_4_ * 3.0;
  auVar279._12_4_ = fStack_288 * auVar82._12_4_ * 3.0;
  auVar279._16_4_ = fStack_288 * auVar82._16_4_ * 3.0;
  auVar279._20_4_ = fStack_288 * auVar82._20_4_ * 3.0;
  auVar279._24_4_ = fStack_288 * auVar82._24_4_ * 3.0;
  auVar279._28_4_ = 0;
  local_2a0 = fStack_288 * auVar15._0_4_ * 3.0;
  fStack_29c = fStack_288 * auVar15._4_4_ * 3.0;
  auVar29._4_4_ = fStack_29c;
  auVar29._0_4_ = local_2a0;
  fStack_298 = fStack_288 * auVar15._8_4_ * 3.0;
  auVar29._8_4_ = fStack_298;
  fStack_294 = fStack_288 * auVar15._12_4_ * 3.0;
  auVar29._12_4_ = fStack_294;
  fStack_290 = fStack_288 * auVar15._16_4_ * 3.0;
  auVar29._16_4_ = fStack_290;
  fStack_28c = fStack_288 * auVar15._20_4_ * 3.0;
  auVar29._20_4_ = fStack_28c;
  fStack_288 = fStack_288 * auVar15._24_4_ * 3.0;
  auVar29._24_4_ = fStack_288;
  auVar29._28_4_ = 0x40400000;
  auVar18 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar92));
  local_4e0 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar251));
  auVar82 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar214));
  auVar15 = vsubps_avx(ZEXT1632(auVar251),ZEXT1632(auVar149));
  auVar83 = vsubps_avx(auVar18,auVar16);
  fVar269 = auVar82._0_4_ + auVar83._0_4_;
  fVar270 = auVar82._4_4_ + auVar83._4_4_;
  fVar271 = auVar82._8_4_ + auVar83._8_4_;
  fVar197 = auVar82._12_4_ + auVar83._12_4_;
  fVar198 = auVar82._16_4_ + auVar83._16_4_;
  fVar199 = auVar82._20_4_ + auVar83._20_4_;
  fVar200 = auVar82._24_4_ + auVar83._24_4_;
  auVar14 = vsubps_avx(local_4e0,auVar17);
  auVar84._0_4_ = auVar15._0_4_ + auVar14._0_4_;
  auVar84._4_4_ = auVar15._4_4_ + auVar14._4_4_;
  auVar84._8_4_ = auVar15._8_4_ + auVar14._8_4_;
  auVar84._12_4_ = auVar15._12_4_ + auVar14._12_4_;
  auVar84._16_4_ = auVar15._16_4_ + auVar14._16_4_;
  auVar84._20_4_ = auVar15._20_4_ + auVar14._20_4_;
  auVar84._24_4_ = auVar15._24_4_ + auVar14._24_4_;
  auVar84._28_4_ = auVar15._28_4_ + auVar14._28_4_;
  local_240 = ZEXT1632(auVar149);
  fVar86 = auVar149._0_4_;
  local_2c0 = (float)local_600._0_4_ + fVar86;
  fVar88 = auVar149._4_4_;
  fStack_2bc = (float)local_600._4_4_ + fVar88;
  fVar123 = auVar149._8_4_;
  fStack_2b8 = fStack_5f8 + fVar123;
  fVar87 = auVar149._12_4_;
  fStack_2b4 = fStack_5f4 + fVar87;
  fStack_2b0 = fStack_5f0 + 0.0;
  fStack_2ac = fStack_5ec + 0.0;
  fStack_2a8 = fStack_5e8 + 0.0;
  local_200 = ZEXT1632(auVar214);
  auVar15 = vsubps_avx(local_200,auVar258);
  local_220 = vpermps_avx2(_DAT_01fb7720,auVar15);
  auVar15 = vsubps_avx(local_240,_local_600);
  local_2e0 = vpermps_avx2(_DAT_01fb7720,auVar15);
  local_260._0_4_ = auVar92._0_4_ + auVar279._0_4_;
  local_260._4_4_ = auVar92._4_4_ + auVar279._4_4_;
  local_260._8_4_ = auVar92._8_4_ + auVar279._8_4_;
  local_260._12_4_ = auVar92._12_4_ + auVar279._12_4_;
  local_260._16_4_ = auVar279._16_4_ + 0.0;
  local_260._20_4_ = auVar279._20_4_ + 0.0;
  local_260._24_4_ = auVar279._24_4_ + 0.0;
  local_260._28_4_ = 0;
  auVar259 = ZEXT1632(auVar92);
  auVar15 = vsubps_avx(auVar259,auVar279);
  auVar19 = vpermps_avx2(_DAT_01fb7720,auVar15);
  fVar89 = auVar251._0_4_;
  local_2a0 = fVar89 + local_2a0;
  fVar166 = auVar251._4_4_;
  fStack_29c = fVar166 + fStack_29c;
  fVar61 = auVar251._8_4_;
  fStack_298 = fVar61 + fStack_298;
  fVar229 = auVar251._12_4_;
  fStack_294 = fVar229 + fStack_294;
  fStack_290 = fStack_290 + 0.0;
  fStack_28c = fStack_28c + 0.0;
  fStack_288 = fStack_288 + 0.0;
  auVar15 = vsubps_avx(ZEXT1632(auVar251),auVar29);
  local_280 = vpermps_avx2(_DAT_01fb7720,auVar15);
  auVar30._4_4_ = fVar88 * fVar270;
  auVar30._0_4_ = fVar86 * fVar269;
  auVar30._8_4_ = fVar123 * fVar271;
  auVar30._12_4_ = fVar87 * fVar197;
  auVar30._16_4_ = fVar198 * 0.0;
  auVar30._20_4_ = fVar199 * 0.0;
  auVar30._24_4_ = fVar200 * 0.0;
  auVar30._28_4_ = auVar15._28_4_;
  auVar8 = vfnmadd231ps_fma(auVar30,local_200,auVar84);
  fStack_2a4 = fStack_5e4 + 0.0;
  auVar31._4_4_ = fStack_2bc * fVar270;
  auVar31._0_4_ = local_2c0 * fVar269;
  auVar31._8_4_ = fStack_2b8 * fVar271;
  auVar31._12_4_ = fStack_2b4 * fVar197;
  auVar31._16_4_ = fStack_2b0 * fVar198;
  auVar31._20_4_ = fStack_2ac * fVar199;
  auVar31._24_4_ = fStack_2a8 * fVar200;
  auVar31._28_4_ = 0;
  auVar9 = vfnmadd231ps_fma(auVar31,auVar84,auVar110);
  auVar32._4_4_ = local_2e0._4_4_ * fVar270;
  auVar32._0_4_ = local_2e0._0_4_ * fVar269;
  auVar32._8_4_ = local_2e0._8_4_ * fVar271;
  auVar32._12_4_ = local_2e0._12_4_ * fVar197;
  auVar32._16_4_ = local_2e0._16_4_ * fVar198;
  auVar32._20_4_ = local_2e0._20_4_ * fVar199;
  auVar32._24_4_ = local_2e0._24_4_ * fVar200;
  auVar32._28_4_ = fStack_5e4 + 0.0;
  auVar131 = vfnmadd231ps_fma(auVar32,local_220,auVar84);
  local_780._0_4_ = auVar17._0_4_;
  local_780._4_4_ = auVar17._4_4_;
  uStack_778._0_4_ = auVar17._8_4_;
  uStack_778._4_4_ = auVar17._12_4_;
  uStack_770._0_4_ = auVar17._16_4_;
  uStack_770._4_4_ = auVar17._20_4_;
  uStack_768._0_4_ = auVar17._24_4_;
  uStack_768._4_4_ = auVar17._28_4_;
  auVar33._4_4_ = (float)local_780._4_4_ * fVar270;
  auVar33._0_4_ = (float)local_780._0_4_ * fVar269;
  auVar33._8_4_ = (float)uStack_778 * fVar271;
  auVar33._12_4_ = uStack_778._4_4_ * fVar197;
  auVar33._16_4_ = (float)uStack_770 * fVar198;
  auVar33._20_4_ = uStack_770._4_4_ * fVar199;
  auVar33._24_4_ = (float)uStack_768 * fVar200;
  auVar33._28_4_ = uStack_768._4_4_;
  auVar65 = vfnmadd231ps_fma(auVar33,auVar16,auVar84);
  auVar211._0_4_ = fVar89 * fVar269;
  auVar211._4_4_ = fVar166 * fVar270;
  auVar211._8_4_ = fVar61 * fVar271;
  auVar211._12_4_ = fVar229 * fVar197;
  auVar211._16_4_ = fVar198 * 0.0;
  auVar211._20_4_ = fVar199 * 0.0;
  auVar211._24_4_ = fVar200 * 0.0;
  auVar211._28_4_ = 0;
  auVar92 = vfnmadd231ps_fma(auVar211,auVar259,auVar84);
  uStack_284 = 0x40400000;
  auVar34._4_4_ = fStack_29c * fVar270;
  auVar34._0_4_ = local_2a0 * fVar269;
  auVar34._8_4_ = fStack_298 * fVar271;
  auVar34._12_4_ = fStack_294 * fVar197;
  auVar34._16_4_ = fStack_290 * fVar198;
  auVar34._20_4_ = fStack_28c * fVar199;
  auVar34._24_4_ = fStack_288 * fVar200;
  auVar34._28_4_ = auVar16._28_4_;
  auVar149 = vfnmadd231ps_fma(auVar34,local_260,auVar84);
  auVar35._4_4_ = local_280._4_4_ * fVar270;
  auVar35._0_4_ = local_280._0_4_ * fVar269;
  auVar35._8_4_ = local_280._8_4_ * fVar271;
  auVar35._12_4_ = local_280._12_4_ * fVar197;
  auVar35._16_4_ = local_280._16_4_ * fVar198;
  auVar35._20_4_ = local_280._20_4_ * fVar199;
  auVar35._24_4_ = local_280._24_4_ * fVar200;
  auVar35._28_4_ = local_280._28_4_;
  auVar167 = vfnmadd231ps_fma(auVar35,auVar19,auVar84);
  auVar36._4_4_ = local_4e0._4_4_ * fVar270;
  auVar36._0_4_ = local_4e0._0_4_ * fVar269;
  auVar36._8_4_ = local_4e0._8_4_ * fVar271;
  auVar36._12_4_ = local_4e0._12_4_ * fVar197;
  auVar36._16_4_ = local_4e0._16_4_ * fVar198;
  auVar36._20_4_ = local_4e0._20_4_ * fVar199;
  auVar36._24_4_ = local_4e0._24_4_ * fVar200;
  auVar36._28_4_ = auVar82._28_4_ + auVar83._28_4_;
  auVar227 = ZEXT3264(auVar18);
  auVar244 = vfnmadd231ps_fma(auVar36,auVar18,auVar84);
  auVar15 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar82 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
  auVar83 = vminps_avx(ZEXT1632(auVar131),ZEXT1632(auVar65));
  auVar83 = vminps_avx(auVar15,auVar83);
  auVar15 = vmaxps_avx(ZEXT1632(auVar131),ZEXT1632(auVar65));
  auVar82 = vmaxps_avx(auVar82,auVar15);
  auVar14 = vminps_avx(ZEXT1632(auVar92),ZEXT1632(auVar149));
  auVar15 = vmaxps_avx(ZEXT1632(auVar92),ZEXT1632(auVar149));
  auVar10 = vminps_avx(ZEXT1632(auVar167),ZEXT1632(auVar244));
  auVar14 = vminps_avx(auVar14,auVar10);
  auVar14 = vminps_avx(auVar83,auVar14);
  auVar83 = vmaxps_avx(ZEXT1632(auVar167),ZEXT1632(auVar244));
  auVar15 = vmaxps_avx(auVar15,auVar83);
  auVar15 = vmaxps_avx(auVar82,auVar15);
  auVar45._4_4_ = fStack_1bc;
  auVar45._0_4_ = local_1c0;
  auVar45._8_4_ = fStack_1b8;
  auVar45._12_4_ = fStack_1b4;
  auVar45._16_4_ = fStack_1b0;
  auVar45._20_4_ = fStack_1ac;
  auVar45._24_4_ = fStack_1a8;
  auVar45._28_4_ = fStack_1a4;
  auVar82 = vcmpps_avx(auVar14,auVar45,2);
  auVar44._4_4_ = fStack_1dc;
  auVar44._0_4_ = local_1e0;
  auVar44._8_4_ = fStack_1d8;
  auVar44._12_4_ = fStack_1d4;
  auVar44._16_4_ = fStack_1d0;
  auVar44._20_4_ = fStack_1cc;
  auVar44._24_4_ = fStack_1c8;
  auVar44._28_4_ = fStack_1c4;
  auVar15 = vcmpps_avx(auVar15,auVar44,5);
  auVar82 = vandps_avx(auVar15,auVar82);
  auVar15 = local_300 & auVar82;
  if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0x7f,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar15 >> 0xbf,0) != '\0') ||
      (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0') {
    auVar15 = vsubps_avx(auVar16,local_200);
    auVar83 = vsubps_avx(auVar18,auVar259);
    fVar270 = auVar15._0_4_ + auVar83._0_4_;
    fVar271 = auVar15._4_4_ + auVar83._4_4_;
    fVar197 = auVar15._8_4_ + auVar83._8_4_;
    fVar198 = auVar15._12_4_ + auVar83._12_4_;
    fVar199 = auVar15._16_4_ + auVar83._16_4_;
    fVar200 = auVar15._20_4_ + auVar83._20_4_;
    fVar90 = auVar15._24_4_ + auVar83._24_4_;
    auVar14 = vsubps_avx(auVar17,local_240);
    auVar10 = vsubps_avx(local_4e0,ZEXT1632(auVar251));
    auVar111._0_4_ = auVar14._0_4_ + auVar10._0_4_;
    auVar111._4_4_ = auVar14._4_4_ + auVar10._4_4_;
    auVar111._8_4_ = auVar14._8_4_ + auVar10._8_4_;
    auVar111._12_4_ = auVar14._12_4_ + auVar10._12_4_;
    auVar111._16_4_ = auVar14._16_4_ + auVar10._16_4_;
    auVar111._20_4_ = auVar14._20_4_ + auVar10._20_4_;
    auVar111._24_4_ = auVar14._24_4_ + auVar10._24_4_;
    fVar269 = auVar10._28_4_;
    auVar111._28_4_ = auVar14._28_4_ + fVar269;
    auVar37._4_4_ = fVar88 * fVar271;
    auVar37._0_4_ = fVar86 * fVar270;
    auVar37._8_4_ = fVar123 * fVar197;
    auVar37._12_4_ = fVar87 * fVar198;
    auVar37._16_4_ = fVar199 * 0.0;
    auVar37._20_4_ = fVar200 * 0.0;
    auVar37._24_4_ = fVar90 * 0.0;
    auVar37._28_4_ = local_4e0._28_4_;
    auVar92 = vfnmadd231ps_fma(auVar37,auVar111,local_200);
    auVar38._4_4_ = fVar271 * fStack_2bc;
    auVar38._0_4_ = fVar270 * local_2c0;
    auVar38._8_4_ = fVar197 * fStack_2b8;
    auVar38._12_4_ = fVar198 * fStack_2b4;
    auVar38._16_4_ = fVar199 * fStack_2b0;
    auVar38._20_4_ = fVar200 * fStack_2ac;
    auVar38._24_4_ = fVar90 * fStack_2a8;
    auVar38._28_4_ = 0;
    auVar8 = vfnmadd213ps_fma(auVar110,auVar111,auVar38);
    auVar39._4_4_ = fVar271 * local_2e0._4_4_;
    auVar39._0_4_ = fVar270 * local_2e0._0_4_;
    auVar39._8_4_ = fVar197 * local_2e0._8_4_;
    auVar39._12_4_ = fVar198 * local_2e0._12_4_;
    auVar39._16_4_ = fVar199 * local_2e0._16_4_;
    auVar39._20_4_ = fVar200 * local_2e0._20_4_;
    auVar39._24_4_ = fVar90 * local_2e0._24_4_;
    auVar39._28_4_ = 0;
    auVar9 = vfnmadd213ps_fma(local_220,auVar111,auVar39);
    auVar40._4_4_ = (float)local_780._4_4_ * fVar271;
    auVar40._0_4_ = (float)local_780._0_4_ * fVar270;
    auVar40._8_4_ = (float)uStack_778 * fVar197;
    auVar40._12_4_ = uStack_778._4_4_ * fVar198;
    auVar40._16_4_ = (float)uStack_770 * fVar199;
    auVar40._20_4_ = uStack_770._4_4_ * fVar200;
    auVar40._24_4_ = (float)uStack_768 * fVar90;
    auVar40._28_4_ = 0;
    auVar251 = vfnmadd231ps_fma(auVar40,auVar111,auVar16);
    auVar136._0_4_ = fVar89 * fVar270;
    auVar136._4_4_ = fVar166 * fVar271;
    auVar136._8_4_ = fVar61 * fVar197;
    auVar136._12_4_ = fVar229 * fVar198;
    auVar136._16_4_ = fVar199 * 0.0;
    auVar136._20_4_ = fVar200 * 0.0;
    auVar136._24_4_ = fVar90 * 0.0;
    auVar136._28_4_ = 0;
    auVar149 = vfnmadd231ps_fma(auVar136,auVar111,auVar259);
    auVar41._4_4_ = fVar271 * fStack_29c;
    auVar41._0_4_ = fVar270 * local_2a0;
    auVar41._8_4_ = fVar197 * fStack_298;
    auVar41._12_4_ = fVar198 * fStack_294;
    auVar41._16_4_ = fVar199 * fStack_290;
    auVar41._20_4_ = fVar200 * fStack_28c;
    auVar41._24_4_ = fVar90 * fStack_288;
    auVar41._28_4_ = fVar269;
    auVar131 = vfnmadd213ps_fma(local_260,auVar111,auVar41);
    auVar42._4_4_ = fVar271 * local_280._4_4_;
    auVar42._0_4_ = fVar270 * local_280._0_4_;
    auVar42._8_4_ = fVar197 * local_280._8_4_;
    auVar42._12_4_ = fVar198 * local_280._12_4_;
    auVar42._16_4_ = fVar199 * local_280._16_4_;
    auVar42._20_4_ = fVar200 * local_280._20_4_;
    auVar42._24_4_ = fVar90 * local_280._24_4_;
    auVar42._28_4_ = fVar269;
    auVar65 = vfnmadd213ps_fma(auVar19,auVar111,auVar42);
    auVar227 = ZEXT1664(auVar65);
    auVar43._4_4_ = fVar271 * local_4e0._4_4_;
    auVar43._0_4_ = fVar270 * local_4e0._0_4_;
    auVar43._8_4_ = fVar197 * local_4e0._8_4_;
    auVar43._12_4_ = fVar198 * local_4e0._12_4_;
    auVar43._16_4_ = fVar199 * local_4e0._16_4_;
    auVar43._20_4_ = fVar200 * local_4e0._20_4_;
    auVar43._24_4_ = fVar90 * local_4e0._24_4_;
    auVar43._28_4_ = auVar15._28_4_ + auVar83._28_4_;
    auVar167 = vfnmadd231ps_fma(auVar43,auVar111,auVar18);
    auVar83 = vminps_avx(ZEXT1632(auVar92),ZEXT1632(auVar8));
    auVar15 = vmaxps_avx(ZEXT1632(auVar92),ZEXT1632(auVar8));
    auVar14 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar251));
    auVar14 = vminps_avx(auVar83,auVar14);
    auVar83 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar251));
    auVar15 = vmaxps_avx(auVar15,auVar83);
    auVar10 = vminps_avx(ZEXT1632(auVar149),ZEXT1632(auVar131));
    auVar83 = vmaxps_avx(ZEXT1632(auVar149),ZEXT1632(auVar131));
    auVar16 = vminps_avx(ZEXT1632(auVar65),ZEXT1632(auVar167));
    auVar10 = vminps_avx(auVar10,auVar16);
    auVar10 = vminps_avx(auVar14,auVar10);
    auVar14 = vmaxps_avx(ZEXT1632(auVar65),ZEXT1632(auVar167));
    auVar83 = vmaxps_avx(auVar83,auVar14);
    auVar83 = vmaxps_avx(auVar15,auVar83);
    auVar15 = vcmpps_avx(auVar10,auVar45,2);
    auVar83 = vcmpps_avx(auVar83,auVar44,5);
    auVar15 = vandps_avx(auVar83,auVar15);
    auVar82 = vandps_avx(auVar82,local_300);
    auVar83 = auVar82 & auVar15;
    if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar83 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar83 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar83 >> 0x7f,0) != '\0') ||
          (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar83 >> 0xbf,0) != '\0') ||
        (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar83[0x1f] < '\0')
    {
      auVar82 = vandps_avx(auVar15,auVar82);
      uVar55 = vmovmskps_avx(auVar82);
      if (uVar55 != 0) {
        auStack_520[uVar54] = uVar55 & 0xff;
        uVar91 = vmovlps_avx(local_440);
        *(undefined8 *)(&uStack_380 + uVar54 * 2) = uVar91;
        uVar56 = vmovlps_avx(auVar69);
        auStack_1a0[uVar54] = uVar56;
        uVar54 = (ulong)((int)uVar54 + 1);
      }
    }
  }
LAB_011386a7:
  if ((int)uVar54 != 0) {
    uVar47 = (int)uVar54 - 1;
    uVar50 = (ulong)uVar47;
    uVar53 = auStack_520[uVar50];
    uVar55 = (&uStack_380)[uVar50 * 2];
    fVar86 = afStack_37c[uVar50 * 2];
    iVar46 = 0;
    for (uVar56 = (ulong)uVar53; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
      iVar46 = iVar46 + 1;
    }
    uVar53 = uVar53 - 1 & uVar53;
    if (uVar53 == 0) {
      uVar54 = (ulong)uVar47;
    }
    auVar69._8_8_ = 0;
    auVar69._0_8_ = auStack_1a0[uVar50];
    auStack_520[uVar50] = uVar53;
    fVar88 = (float)(iVar46 + 1) * 0.14285715;
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * (float)iVar46 * 0.14285715)),ZEXT416(uVar55),
                             ZEXT416((uint)(1.0 - (float)iVar46 * 0.14285715)));
    auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * fVar88)),ZEXT416(uVar55),
                             ZEXT416((uint)(1.0 - fVar88)));
    fVar88 = auVar9._0_4_;
    auVar196._0_4_ = auVar8._0_4_;
    fVar86 = fVar88 - auVar196._0_4_;
    if (fVar86 < 0.16666667) {
      auVar131 = vshufps_avx(auVar69,auVar69,0x50);
      auVar99._8_4_ = 0x3f800000;
      auVar99._0_8_ = 0x3f8000003f800000;
      auVar99._12_4_ = 0x3f800000;
      auVar65 = vsubps_avx(auVar99,auVar131);
      fVar123 = auVar131._0_4_;
      auVar142._0_4_ = fVar123 * fVar138;
      fVar87 = auVar131._4_4_;
      auVar142._4_4_ = fVar87 * fVar147;
      fVar89 = auVar131._8_4_;
      auVar142._8_4_ = fVar89 * fVar138;
      fVar166 = auVar131._12_4_;
      auVar142._12_4_ = fVar166 * fVar147;
      auVar155._0_4_ = fVar123 * fVar148;
      auVar155._4_4_ = fVar87 * fVar260;
      auVar155._8_4_ = fVar89 * fVar148;
      auVar155._12_4_ = fVar166 * fVar260;
      auVar180._0_4_ = fVar123 * fVar201;
      auVar180._4_4_ = fVar87 * fVar212;
      auVar180._8_4_ = fVar89 * fVar201;
      auVar180._12_4_ = fVar166 * fVar212;
      auVar71._0_4_ = fVar123 * fVar213;
      auVar71._4_4_ = fVar87 * fVar228;
      auVar71._8_4_ = fVar89 * fVar213;
      auVar71._12_4_ = fVar166 * fVar228;
      auVar131 = vfmadd231ps_fma(auVar142,auVar65,auVar190);
      auVar92 = vfmadd231ps_fma(auVar155,auVar65,auVar233);
      auVar251 = vfmadd231ps_fma(auVar180,auVar65,auVar250);
      auVar65 = vfmadd231ps_fma(auVar71,auVar65,auVar262);
      auVar137._16_16_ = auVar131;
      auVar137._0_16_ = auVar131;
      auVar146._16_16_ = auVar92;
      auVar146._0_16_ = auVar92;
      auVar164._16_16_ = auVar251;
      auVar164._0_16_ = auVar251;
      auVar196._4_4_ = auVar196._0_4_;
      auVar196._8_4_ = auVar196._0_4_;
      auVar196._12_4_ = auVar196._0_4_;
      auVar196._20_4_ = fVar88;
      auVar196._16_4_ = fVar88;
      auVar196._24_4_ = fVar88;
      auVar196._28_4_ = fVar88;
      auVar82 = vsubps_avx(auVar146,auVar137);
      auVar92 = vfmadd213ps_fma(auVar82,auVar196,auVar137);
      auVar82 = vsubps_avx(auVar164,auVar146);
      auVar149 = vfmadd213ps_fma(auVar82,auVar196,auVar146);
      auVar131 = vsubps_avx(auVar65,auVar251);
      auVar85._16_16_ = auVar131;
      auVar85._0_16_ = auVar131;
      auVar131 = vfmadd213ps_fma(auVar85,auVar196,auVar164);
      auVar82 = vsubps_avx(ZEXT1632(auVar149),ZEXT1632(auVar92));
      auVar65 = vfmadd213ps_fma(auVar82,auVar196,ZEXT1632(auVar92));
      auVar82 = vsubps_avx(ZEXT1632(auVar131),ZEXT1632(auVar149));
      auVar131 = vfmadd213ps_fma(auVar82,auVar196,ZEXT1632(auVar149));
      auVar82 = vsubps_avx(ZEXT1632(auVar131),ZEXT1632(auVar65));
      auVar187 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar82,auVar196);
      fVar229 = auVar82._4_4_ * 3.0;
      fVar123 = fVar86 * 0.33333334;
      local_4e0._0_8_ =
           CONCAT44(auVar187._4_4_ + fVar123 * fVar229,
                    auVar187._0_4_ + fVar123 * auVar82._0_4_ * 3.0);
      local_4e0._8_4_ = auVar187._8_4_ + fVar123 * auVar82._8_4_ * 3.0;
      local_4e0._12_4_ = auVar187._12_4_ + fVar123 * auVar82._12_4_ * 3.0;
      auVar65 = vshufpd_avx(auVar187,auVar187,3);
      auVar92 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar131 = vsubps_avx(auVar65,auVar187);
      auVar251 = vsubps_avx(auVar92,(undefined1  [16])0x0);
      auVar72._0_4_ = auVar131._0_4_ + auVar251._0_4_;
      auVar72._4_4_ = auVar131._4_4_ + auVar251._4_4_;
      auVar72._8_4_ = auVar131._8_4_ + auVar251._8_4_;
      auVar72._12_4_ = auVar131._12_4_ + auVar251._12_4_;
      auVar131 = vshufps_avx(auVar187,auVar187,0xb1);
      auVar251 = vshufps_avx(local_4e0._0_16_,local_4e0._0_16_,0xb1);
      auVar275._4_4_ = auVar72._0_4_;
      auVar275._0_4_ = auVar72._0_4_;
      auVar275._8_4_ = auVar72._0_4_;
      auVar275._12_4_ = auVar72._0_4_;
      auVar149 = vshufps_avx(auVar72,auVar72,0x55);
      fVar87 = auVar149._0_4_;
      auVar73._0_4_ = fVar87 * auVar131._0_4_;
      fVar89 = auVar149._4_4_;
      auVar73._4_4_ = fVar89 * auVar131._4_4_;
      fVar166 = auVar149._8_4_;
      auVar73._8_4_ = fVar166 * auVar131._8_4_;
      fVar61 = auVar149._12_4_;
      auVar73._12_4_ = fVar61 * auVar131._12_4_;
      auVar156._0_4_ = fVar87 * auVar251._0_4_;
      auVar156._4_4_ = fVar89 * auVar251._4_4_;
      auVar156._8_4_ = fVar166 * auVar251._8_4_;
      auVar156._12_4_ = fVar61 * auVar251._12_4_;
      auVar167 = vfmadd231ps_fma(auVar73,auVar275,auVar187);
      auVar244 = vfmadd231ps_fma(auVar156,auVar275,local_4e0._0_16_);
      auVar251 = vshufps_avx(auVar167,auVar167,0xe8);
      auVar149 = vshufps_avx(auVar244,auVar244,0xe8);
      auVar131 = vcmpps_avx(auVar251,auVar149,1);
      uVar55 = vextractps_avx(auVar131,0);
      auVar214 = auVar244;
      if ((uVar55 & 1) == 0) {
        auVar214 = auVar167;
      }
      auVar127._0_4_ = fVar123 * auVar82._16_4_ * 3.0;
      auVar127._4_4_ = fVar123 * fVar229;
      auVar127._8_4_ = fVar123 * auVar82._24_4_ * 3.0;
      auVar127._12_4_ = fVar123 * auVar227._28_4_;
      auVar273 = vsubps_avx((undefined1  [16])0x0,auVar127);
      auVar128 = vshufps_avx(auVar273,auVar273,0xb1);
      auVar230 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar191._0_4_ = fVar87 * auVar128._0_4_;
      auVar191._4_4_ = fVar89 * auVar128._4_4_;
      auVar191._8_4_ = fVar166 * auVar128._8_4_;
      auVar191._12_4_ = fVar61 * auVar128._12_4_;
      auVar205._0_4_ = auVar230._0_4_ * fVar87;
      auVar205._4_4_ = auVar230._4_4_ * fVar89;
      auVar205._8_4_ = auVar230._8_4_ * fVar166;
      auVar205._12_4_ = auVar230._12_4_ * fVar61;
      auVar20 = vfmadd231ps_fma(auVar191,auVar275,auVar273);
      auVar21 = vfmadd231ps_fma(auVar205,(undefined1  [16])0x0,auVar275);
      auVar230 = vshufps_avx(auVar20,auVar20,0xe8);
      auVar272 = vshufps_avx(auVar21,auVar21,0xe8);
      auVar227 = ZEXT1664(auVar272);
      auVar128 = vcmpps_avx(auVar230,auVar272,1);
      uVar55 = vextractps_avx(auVar128,0);
      auVar66 = auVar21;
      if ((uVar55 & 1) == 0) {
        auVar66 = auVar20;
      }
      auVar214 = vmaxss_avx(auVar66,auVar214);
      auVar251 = vminps_avx(auVar251,auVar149);
      auVar149 = vminps_avx(auVar230,auVar272);
      auVar149 = vminps_avx(auVar251,auVar149);
      auVar131 = vshufps_avx(auVar131,auVar131,0x55);
      auVar131 = vblendps_avx(auVar131,auVar128,2);
      auVar128 = vpslld_avx(auVar131,0x1f);
      auVar131 = vshufpd_avx(auVar244,auVar244,1);
      auVar131 = vinsertps_avx(auVar131,auVar21,0x9c);
      auVar251 = vshufpd_avx(auVar167,auVar167,1);
      auVar251 = vinsertps_avx(auVar251,auVar20,0x9c);
      auVar131 = vblendvps_avx(auVar251,auVar131,auVar128);
      auVar251 = vmovshdup_avx(auVar131);
      auVar131 = vmaxss_avx(auVar251,auVar131);
      fVar166 = auVar149._0_4_;
      auVar251 = vmovshdup_avx(auVar149);
      fVar89 = auVar131._0_4_;
      fVar123 = auVar251._0_4_;
      fVar87 = auVar214._0_4_;
      if (((0.0001 <= fVar166) || (fVar89 <= -0.0001)) && (0.0001 <= fVar123 || fVar89 <= -0.0001))
      goto code_r0x011389b4;
      goto LAB_011389db;
    }
    local_440 = vinsertps_avx(auVar8,auVar9,0x10);
    goto LAB_011380f7;
  }
  if (bVar58) goto LAB_01139584;
  uVar57 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar81._4_4_ = uVar57;
  auVar81._0_4_ = uVar57;
  auVar81._8_4_ = uVar57;
  auVar81._12_4_ = uVar57;
  auVar8 = vcmpps_avx(local_450,auVar81,2);
  uVar48 = vmovmskps_avx(auVar8);
  uVar49 = (ulong)((uint)uVar59 & uVar48);
  goto LAB_011378df;
code_r0x011389b4:
  auVar251 = vcmpps_avx(auVar251,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar167 = vcmpps_avx(auVar149,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar251 = vandps_avx(auVar167,auVar251);
  if (fVar87 <= -0.0001 || (auVar251 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_011386a7;
LAB_011389db:
  auVar167 = vcmpps_avx(auVar149,_DAT_01f45a50,1);
  auVar244 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar251 = vcmpss_avx(auVar214,ZEXT816(0) << 0x20,1);
  auVar100._8_4_ = 0x3f800000;
  auVar100._0_8_ = 0x3f8000003f800000;
  auVar100._12_4_ = 0x3f800000;
  auVar117._8_4_ = 0xbf800000;
  auVar117._0_8_ = 0xbf800000bf800000;
  auVar117._12_4_ = 0xbf800000;
  auVar251 = vblendvps_avx(auVar100,auVar117,auVar251);
  auVar167 = vblendvps_avx(auVar100,auVar117,auVar167);
  fVar229 = auVar167._0_4_;
  fVar61 = auVar251._0_4_;
  auVar251 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar229 == fVar61) && (!NAN(fVar229) && !NAN(fVar61))) {
    auVar251 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar229 == fVar61) && (!NAN(fVar229) && !NAN(fVar61))) {
    auVar244 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar167 = vmovshdup_avx(auVar167);
  fVar269 = auVar167._0_4_;
  if ((fVar229 != fVar269) || (NAN(fVar229) || NAN(fVar269))) {
    if ((fVar123 != fVar166) || (NAN(fVar123) || NAN(fVar166))) {
      auVar129._0_8_ = auVar149._0_8_ ^ 0x8000000080000000;
      auVar129._8_4_ = auVar149._8_4_ ^ 0x80000000;
      auVar129._12_4_ = auVar149._12_4_ ^ 0x80000000;
      auVar130._0_4_ = -fVar166 / (fVar123 - fVar166);
      auVar130._4_12_ = auVar129._4_12_;
      auVar149 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar130._0_4_)),auVar130,ZEXT416(0));
      auVar167 = auVar149;
    }
    else {
      auVar149 = ZEXT816(0) << 0x20;
      if ((fVar166 != 0.0) || (auVar167 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar166))) {
        auVar149 = SUB6416(ZEXT464(0x7f800000),0);
        auVar167 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar251 = vminss_avx(auVar251,auVar149);
    auVar244 = vmaxss_avx(auVar167,auVar244);
  }
  auVar131 = vcmpss_avx(auVar131,ZEXT416(0),1);
  auVar101._8_4_ = 0x3f800000;
  auVar101._0_8_ = 0x3f8000003f800000;
  auVar101._12_4_ = 0x3f800000;
  auVar118._8_4_ = 0xbf800000;
  auVar118._0_8_ = 0xbf800000bf800000;
  auVar118._12_4_ = 0xbf800000;
  auVar131 = vblendvps_avx(auVar101,auVar118,auVar131);
  fVar123 = auVar131._0_4_;
  if ((fVar61 != fVar123) || (NAN(fVar61) || NAN(fVar123))) {
    if ((fVar89 != fVar87) || (NAN(fVar89) || NAN(fVar87))) {
      auVar74._0_8_ = auVar214._0_8_ ^ 0x8000000080000000;
      auVar74._8_4_ = auVar214._8_4_ ^ 0x80000000;
      auVar74._12_4_ = auVar214._12_4_ ^ 0x80000000;
      auVar132._0_4_ = -fVar87 / (fVar89 - fVar87);
      auVar132._4_12_ = auVar74._4_12_;
      auVar131 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar132._0_4_)),auVar132,ZEXT416(0));
      auVar149 = auVar131;
    }
    else {
      auVar131 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar87 != 0.0) || (auVar149 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar87))) {
        auVar131 = SUB6416(ZEXT464(0xff800000),0);
        auVar149 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar251 = vminss_avx(auVar251,auVar149);
    auVar244 = vmaxss_avx(auVar131,auVar244);
  }
  if ((fVar269 != fVar123) || (NAN(fVar269) || NAN(fVar123))) {
    auVar251 = vminss_avx(auVar251,SUB6416(ZEXT464(0x3f800000),0));
    auVar244 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar244);
  }
  auVar131 = vmaxss_avx(ZEXT816(0) << 0x40,auVar251);
  auVar251 = vminss_avx(auVar244,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar251._0_4_ < auVar131._0_4_) goto LAB_011386a7;
  auVar131 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar131._0_4_ + -0.1)));
  auVar251 = vminss_avx(ZEXT416((uint)(auVar251._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar143._0_8_ = auVar187._0_8_;
  auVar143._8_8_ = auVar143._0_8_;
  auVar219._8_8_ = local_4e0._0_8_;
  auVar219._0_8_ = local_4e0._0_8_;
  auVar234._8_8_ = auVar273._0_8_;
  auVar234._0_8_ = auVar273._0_8_;
  auVar149 = vshufpd_avx(local_4e0._0_16_,local_4e0._0_16_,3);
  auVar167 = vshufpd_avx(auVar273,auVar273,3);
  auVar244 = vshufps_avx(auVar131,auVar251,0);
  auVar75._8_4_ = 0x3f800000;
  auVar75._0_8_ = 0x3f8000003f800000;
  auVar75._12_4_ = 0x3f800000;
  auVar187 = vsubps_avx(auVar75,auVar244);
  local_640 = auVar65._0_4_;
  fStack_63c = auVar65._4_4_;
  fStack_638 = auVar65._8_4_;
  fStack_634 = auVar65._12_4_;
  fVar123 = auVar244._0_4_;
  auVar76._0_4_ = fVar123 * local_640;
  fVar87 = auVar244._4_4_;
  auVar76._4_4_ = fVar87 * fStack_63c;
  fVar89 = auVar244._8_4_;
  auVar76._8_4_ = fVar89 * fStack_638;
  fVar166 = auVar244._12_4_;
  auVar76._12_4_ = fVar166 * fStack_634;
  auVar181._0_4_ = fVar123 * auVar149._0_4_;
  auVar181._4_4_ = fVar87 * auVar149._4_4_;
  auVar181._8_4_ = fVar89 * auVar149._8_4_;
  auVar181._12_4_ = fVar166 * auVar149._12_4_;
  auVar192._0_4_ = fVar123 * auVar167._0_4_;
  auVar192._4_4_ = fVar87 * auVar167._4_4_;
  auVar192._8_4_ = fVar89 * auVar167._8_4_;
  auVar192._12_4_ = fVar166 * auVar167._12_4_;
  auVar206._0_4_ = fVar123 * auVar92._0_4_;
  auVar206._4_4_ = fVar87 * auVar92._4_4_;
  auVar206._8_4_ = fVar89 * auVar92._8_4_;
  auVar206._12_4_ = fVar166 * auVar92._12_4_;
  auVar149 = vfmadd231ps_fma(auVar76,auVar187,auVar143);
  auVar167 = vfmadd231ps_fma(auVar181,auVar187,auVar219);
  auVar244 = vfmadd231ps_fma(auVar192,auVar187,auVar234);
  auVar187 = vfmadd231ps_fma(auVar206,auVar187,ZEXT816(0));
  auVar65 = vmovshdup_avx(auVar69);
  auVar273 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * auVar131._0_4_)),auVar69,
                             ZEXT416((uint)(1.0 - auVar131._0_4_)));
  auVar69 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * auVar251._0_4_)),auVar69,
                            ZEXT416((uint)(1.0 - auVar251._0_4_)));
  fVar123 = 1.0 / fVar86;
  auVar131 = vsubps_avx(auVar167,auVar149);
  auVar220._0_4_ = auVar131._0_4_ * 3.0;
  auVar220._4_4_ = auVar131._4_4_ * 3.0;
  auVar220._8_4_ = auVar131._8_4_ * 3.0;
  auVar220._12_4_ = auVar131._12_4_ * 3.0;
  auVar131 = vsubps_avx(auVar244,auVar167);
  auVar235._0_4_ = auVar131._0_4_ * 3.0;
  auVar235._4_4_ = auVar131._4_4_ * 3.0;
  auVar235._8_4_ = auVar131._8_4_ * 3.0;
  auVar235._12_4_ = auVar131._12_4_ * 3.0;
  auVar131 = vsubps_avx(auVar187,auVar244);
  auVar245._0_4_ = auVar131._0_4_ * 3.0;
  auVar245._4_4_ = auVar131._4_4_ * 3.0;
  auVar245._8_4_ = auVar131._8_4_ * 3.0;
  auVar245._12_4_ = auVar131._12_4_ * 3.0;
  auVar65 = vminps_avx(auVar235,auVar245);
  auVar131 = vmaxps_avx(auVar235,auVar245);
  auVar65 = vminps_avx(auVar220,auVar65);
  auVar131 = vmaxps_avx(auVar220,auVar131);
  auVar92 = vshufpd_avx(auVar65,auVar65,3);
  auVar251 = vshufpd_avx(auVar131,auVar131,3);
  auVar65 = vminps_avx(auVar65,auVar92);
  auVar131 = vmaxps_avx(auVar131,auVar251);
  auVar236._0_4_ = auVar65._0_4_ * fVar123;
  auVar236._4_4_ = auVar65._4_4_ * fVar123;
  auVar236._8_4_ = auVar65._8_4_ * fVar123;
  auVar236._12_4_ = auVar65._12_4_ * fVar123;
  auVar221._0_4_ = auVar131._0_4_ * fVar123;
  auVar221._4_4_ = auVar131._4_4_ * fVar123;
  auVar221._8_4_ = auVar131._8_4_ * fVar123;
  auVar221._12_4_ = auVar131._12_4_ * fVar123;
  fVar123 = 1.0 / (auVar69._0_4_ - auVar273._0_4_);
  auVar131 = vshufpd_avx(auVar149,auVar149,3);
  auVar65 = vshufpd_avx(auVar167,auVar167,3);
  auVar92 = vshufpd_avx(auVar244,auVar244,3);
  auVar251 = vshufpd_avx(auVar187,auVar187,3);
  auVar131 = vsubps_avx(auVar131,auVar149);
  auVar149 = vsubps_avx(auVar65,auVar167);
  auVar167 = vsubps_avx(auVar92,auVar244);
  auVar251 = vsubps_avx(auVar251,auVar187);
  auVar65 = vminps_avx(auVar131,auVar149);
  auVar131 = vmaxps_avx(auVar131,auVar149);
  auVar92 = vminps_avx(auVar167,auVar251);
  auVar92 = vminps_avx(auVar65,auVar92);
  auVar65 = vmaxps_avx(auVar167,auVar251);
  auVar131 = vmaxps_avx(auVar131,auVar65);
  auVar263._0_4_ = fVar123 * auVar92._0_4_;
  auVar263._4_4_ = fVar123 * auVar92._4_4_;
  auVar263._8_4_ = fVar123 * auVar92._8_4_;
  auVar263._12_4_ = fVar123 * auVar92._12_4_;
  auVar252._0_4_ = fVar123 * auVar131._0_4_;
  auVar252._4_4_ = fVar123 * auVar131._4_4_;
  auVar252._8_4_ = fVar123 * auVar131._8_4_;
  auVar252._12_4_ = fVar123 * auVar131._12_4_;
  auVar251 = vinsertps_avx(auVar8,auVar273,0x10);
  auVar149 = vinsertps_avx(auVar9,auVar69,0x10);
  auVar246._0_4_ = (auVar251._0_4_ + auVar149._0_4_) * 0.5;
  auVar246._4_4_ = (auVar251._4_4_ + auVar149._4_4_) * 0.5;
  auVar246._8_4_ = (auVar251._8_4_ + auVar149._8_4_) * 0.5;
  auVar246._12_4_ = (auVar251._12_4_ + auVar149._12_4_) * 0.5;
  auVar77._4_4_ = auVar246._0_4_;
  auVar77._0_4_ = auVar246._0_4_;
  auVar77._8_4_ = auVar246._0_4_;
  auVar77._12_4_ = auVar246._0_4_;
  auVar131 = vfmadd213ps_fma(local_390,auVar77,auVar11);
  auVar65 = vfmadd213ps_fma(local_3a0,auVar77,auVar12);
  auVar92 = vfmadd213ps_fma(local_3b0,auVar77,auVar13);
  auVar9 = vsubps_avx(auVar65,auVar131);
  auVar131 = vfmadd213ps_fma(auVar9,auVar77,auVar131);
  auVar9 = vsubps_avx(auVar92,auVar65);
  auVar9 = vfmadd213ps_fma(auVar9,auVar77,auVar65);
  auVar9 = vsubps_avx(auVar9,auVar131);
  auVar131 = vfmadd231ps_fma(auVar131,auVar9,auVar77);
  auVar78._0_8_ = CONCAT44(auVar9._4_4_ * 3.0,auVar9._0_4_ * 3.0);
  auVar78._8_4_ = auVar9._8_4_ * 3.0;
  auVar78._12_4_ = auVar9._12_4_ * 3.0;
  auVar276._8_8_ = auVar131._0_8_;
  auVar276._0_8_ = auVar131._0_8_;
  auVar9 = vshufpd_avx(auVar131,auVar131,3);
  auVar131 = vshufps_avx(auVar246,auVar246,0x55);
  auVar244 = vsubps_avx(auVar9,auVar276);
  auVar214 = vfmadd231ps_fma(auVar276,auVar131,auVar244);
  auVar282._8_8_ = auVar78._0_8_;
  auVar282._0_8_ = auVar78._0_8_;
  auVar9 = vshufpd_avx(auVar78,auVar78,3);
  auVar9 = vsubps_avx(auVar9,auVar282);
  auVar187 = vfmadd213ps_fma(auVar9,auVar131,auVar282);
  auVar131 = vmovshdup_avx(auVar187);
  auVar283._0_8_ = auVar131._0_8_ ^ 0x8000000080000000;
  auVar283._8_4_ = auVar131._8_4_ ^ 0x80000000;
  auVar283._12_4_ = auVar131._12_4_ ^ 0x80000000;
  auVar65 = vmovshdup_avx(auVar244);
  auVar9 = vunpcklps_avx(auVar65,auVar283);
  auVar92 = vshufps_avx(auVar9,auVar283,4);
  auVar167 = vshufps_avx(auVar246,auVar246,0x54);
  auVar133._0_8_ = auVar244._0_8_ ^ 0x8000000080000000;
  auVar133._8_4_ = auVar244._8_4_ ^ 0x80000000;
  auVar133._12_4_ = auVar244._12_4_ ^ 0x80000000;
  auVar9 = vmovlhps_avx(auVar133,auVar187);
  auVar9 = vshufps_avx(auVar9,auVar187,8);
  auVar131 = vfmsub231ss_fma(ZEXT416((uint)(auVar244._0_4_ * auVar131._0_4_)),auVar65,auVar187);
  uVar57 = auVar131._0_4_;
  auVar79._4_4_ = uVar57;
  auVar79._0_4_ = uVar57;
  auVar79._8_4_ = uVar57;
  auVar79._12_4_ = uVar57;
  auVar131 = vdivps_avx(auVar92,auVar79);
  auVar65 = vdivps_avx(auVar9,auVar79);
  fVar89 = auVar214._0_4_;
  fVar123 = auVar131._0_4_;
  auVar9 = vshufps_avx(auVar214,auVar214,0x55);
  fVar87 = auVar65._0_4_;
  auVar80._0_4_ = fVar89 * fVar123 + auVar9._0_4_ * fVar87;
  auVar80._4_4_ = fVar89 * auVar131._4_4_ + auVar9._4_4_ * auVar65._4_4_;
  auVar80._8_4_ = fVar89 * auVar131._8_4_ + auVar9._8_4_ * auVar65._8_4_;
  auVar80._12_4_ = fVar89 * auVar131._12_4_ + auVar9._12_4_ * auVar65._12_4_;
  auVar272 = vsubps_avx(auVar167,auVar80);
  auVar167 = vmovshdup_avx(auVar131);
  auVar9 = vinsertps_avx(auVar236,auVar263,0x1c);
  auVar157._0_4_ = auVar167._0_4_ * auVar9._0_4_;
  auVar157._4_4_ = auVar167._4_4_ * auVar9._4_4_;
  auVar157._8_4_ = auVar167._8_4_ * auVar9._8_4_;
  auVar157._12_4_ = auVar167._12_4_ * auVar9._12_4_;
  auVar92 = vinsertps_avx(auVar221,auVar252,0x1c);
  auVar102._0_4_ = auVar92._0_4_ * auVar167._0_4_;
  auVar102._4_4_ = auVar92._4_4_ * auVar167._4_4_;
  auVar102._8_4_ = auVar92._8_4_ * auVar167._8_4_;
  auVar102._12_4_ = auVar92._12_4_ * auVar167._12_4_;
  auVar214 = vminps_avx(auVar157,auVar102);
  auVar187 = vmaxps_avx(auVar102,auVar157);
  auVar167 = vinsertps_avx(auVar263,auVar236,0x4c);
  auVar128 = vmovshdup_avx(auVar65);
  auVar244 = vinsertps_avx(auVar252,auVar221,0x4c);
  auVar253._0_4_ = auVar128._0_4_ * auVar167._0_4_;
  auVar253._4_4_ = auVar128._4_4_ * auVar167._4_4_;
  auVar253._8_4_ = auVar128._8_4_ * auVar167._8_4_;
  auVar253._12_4_ = auVar128._12_4_ * auVar167._12_4_;
  auVar237._0_4_ = auVar128._0_4_ * auVar244._0_4_;
  auVar237._4_4_ = auVar128._4_4_ * auVar244._4_4_;
  auVar237._8_4_ = auVar128._8_4_ * auVar244._8_4_;
  auVar237._12_4_ = auVar128._12_4_ * auVar244._12_4_;
  auVar128 = vminps_avx(auVar253,auVar237);
  auVar264._0_4_ = auVar214._0_4_ + auVar128._0_4_;
  auVar264._4_4_ = auVar214._4_4_ + auVar128._4_4_;
  auVar264._8_4_ = auVar214._8_4_ + auVar128._8_4_;
  auVar264._12_4_ = auVar214._12_4_ + auVar128._12_4_;
  auVar214 = vmaxps_avx(auVar237,auVar253);
  auVar103._0_4_ = auVar214._0_4_ + auVar187._0_4_;
  auVar103._4_4_ = auVar214._4_4_ + auVar187._4_4_;
  auVar103._8_4_ = auVar214._8_4_ + auVar187._8_4_;
  auVar103._12_4_ = auVar214._12_4_ + auVar187._12_4_;
  auVar238._8_8_ = 0x3f80000000000000;
  auVar238._0_8_ = 0x3f80000000000000;
  auVar187 = vsubps_avx(auVar238,auVar103);
  auVar214 = vsubps_avx(auVar238,auVar264);
  auVar128 = vsubps_avx(auVar251,auVar246);
  auVar230 = vsubps_avx(auVar149,auVar246);
  auVar119._0_4_ = fVar123 * auVar9._0_4_;
  auVar119._4_4_ = fVar123 * auVar9._4_4_;
  auVar119._8_4_ = fVar123 * auVar9._8_4_;
  auVar119._12_4_ = fVar123 * auVar9._12_4_;
  auVar265._0_4_ = fVar123 * auVar92._0_4_;
  auVar265._4_4_ = fVar123 * auVar92._4_4_;
  auVar265._8_4_ = fVar123 * auVar92._8_4_;
  auVar265._12_4_ = fVar123 * auVar92._12_4_;
  auVar92 = vminps_avx(auVar119,auVar265);
  auVar9 = vmaxps_avx(auVar265,auVar119);
  auVar158._0_4_ = fVar87 * auVar167._0_4_;
  auVar158._4_4_ = fVar87 * auVar167._4_4_;
  auVar158._8_4_ = fVar87 * auVar167._8_4_;
  auVar158._12_4_ = fVar87 * auVar167._12_4_;
  auVar222._0_4_ = fVar87 * auVar244._0_4_;
  auVar222._4_4_ = fVar87 * auVar244._4_4_;
  auVar222._8_4_ = fVar87 * auVar244._8_4_;
  auVar222._12_4_ = fVar87 * auVar244._12_4_;
  auVar167 = vminps_avx(auVar158,auVar222);
  auVar266._0_4_ = auVar92._0_4_ + auVar167._0_4_;
  auVar266._4_4_ = auVar92._4_4_ + auVar167._4_4_;
  auVar266._8_4_ = auVar92._8_4_ + auVar167._8_4_;
  auVar266._12_4_ = auVar92._12_4_ + auVar167._12_4_;
  fVar269 = auVar128._0_4_;
  auVar277._0_4_ = fVar269 * auVar187._0_4_;
  fVar270 = auVar128._4_4_;
  auVar277._4_4_ = fVar270 * auVar187._4_4_;
  fVar271 = auVar128._8_4_;
  auVar277._8_4_ = fVar271 * auVar187._8_4_;
  fVar197 = auVar128._12_4_;
  auVar277._12_4_ = fVar197 * auVar187._12_4_;
  auVar92 = vmaxps_avx(auVar222,auVar158);
  auVar223._0_4_ = fVar269 * auVar214._0_4_;
  auVar223._4_4_ = fVar270 * auVar214._4_4_;
  auVar223._8_4_ = fVar271 * auVar214._8_4_;
  auVar223._12_4_ = fVar197 * auVar214._12_4_;
  fVar89 = auVar230._0_4_;
  auVar104._0_4_ = fVar89 * auVar187._0_4_;
  fVar166 = auVar230._4_4_;
  auVar104._4_4_ = fVar166 * auVar187._4_4_;
  fVar61 = auVar230._8_4_;
  auVar104._8_4_ = fVar61 * auVar187._8_4_;
  fVar229 = auVar230._12_4_;
  auVar104._12_4_ = fVar229 * auVar187._12_4_;
  auVar239._0_4_ = fVar89 * auVar214._0_4_;
  auVar239._4_4_ = fVar166 * auVar214._4_4_;
  auVar239._8_4_ = fVar61 * auVar214._8_4_;
  auVar239._12_4_ = fVar229 * auVar214._12_4_;
  auVar120._0_4_ = auVar9._0_4_ + auVar92._0_4_;
  auVar120._4_4_ = auVar9._4_4_ + auVar92._4_4_;
  auVar120._8_4_ = auVar9._8_4_ + auVar92._8_4_;
  auVar120._12_4_ = auVar9._12_4_ + auVar92._12_4_;
  auVar159._8_8_ = 0x3f800000;
  auVar159._0_8_ = 0x3f800000;
  auVar9 = vsubps_avx(auVar159,auVar120);
  auVar92 = vsubps_avx(auVar159,auVar266);
  auVar267._0_4_ = fVar269 * auVar9._0_4_;
  auVar267._4_4_ = fVar270 * auVar9._4_4_;
  auVar267._8_4_ = fVar271 * auVar9._8_4_;
  auVar267._12_4_ = fVar197 * auVar9._12_4_;
  auVar254._0_4_ = fVar269 * auVar92._0_4_;
  auVar254._4_4_ = fVar270 * auVar92._4_4_;
  auVar254._8_4_ = fVar271 * auVar92._8_4_;
  auVar254._12_4_ = fVar197 * auVar92._12_4_;
  auVar121._0_4_ = fVar89 * auVar9._0_4_;
  auVar121._4_4_ = fVar166 * auVar9._4_4_;
  auVar121._8_4_ = fVar61 * auVar9._8_4_;
  auVar121._12_4_ = fVar229 * auVar9._12_4_;
  auVar160._0_4_ = fVar89 * auVar92._0_4_;
  auVar160._4_4_ = fVar166 * auVar92._4_4_;
  auVar160._8_4_ = fVar61 * auVar92._8_4_;
  auVar160._12_4_ = fVar229 * auVar92._12_4_;
  auVar9 = vminps_avx(auVar267,auVar254);
  auVar92 = vminps_avx(auVar121,auVar160);
  auVar9 = vminps_avx(auVar9,auVar92);
  auVar92 = vmaxps_avx(auVar254,auVar267);
  auVar167 = vmaxps_avx(auVar160,auVar121);
  auVar244 = vminps_avx(auVar277,auVar223);
  auVar187 = vminps_avx(auVar104,auVar239);
  auVar244 = vminps_avx(auVar244,auVar187);
  auVar9 = vhaddps_avx(auVar9,auVar244);
  auVar92 = vmaxps_avx(auVar167,auVar92);
  auVar167 = vmaxps_avx(auVar223,auVar277);
  auVar244 = vmaxps_avx(auVar239,auVar104);
  auVar167 = vmaxps_avx(auVar244,auVar167);
  auVar92 = vhaddps_avx(auVar92,auVar167);
  auVar9 = vshufps_avx(auVar9,auVar9,0xe8);
  auVar92 = vshufps_avx(auVar92,auVar92,0xe8);
  auVar240._0_4_ = auVar272._0_4_ + auVar9._0_4_;
  auVar240._4_4_ = auVar272._4_4_ + auVar9._4_4_;
  auVar240._8_4_ = auVar272._8_4_ + auVar9._8_4_;
  auVar240._12_4_ = auVar272._12_4_ + auVar9._12_4_;
  auVar224._0_4_ = auVar272._0_4_ + auVar92._0_4_;
  auVar224._4_4_ = auVar272._4_4_ + auVar92._4_4_;
  auVar224._8_4_ = auVar272._8_4_ + auVar92._8_4_;
  auVar224._12_4_ = auVar272._12_4_ + auVar92._12_4_;
  auVar227 = ZEXT1664(auVar224);
  auVar9 = vmaxps_avx(auVar251,auVar240);
  auVar92 = vminps_avx(auVar224,auVar149);
  auVar9 = vcmpps_avx(auVar92,auVar9,1);
  auVar9 = vshufps_avx(auVar9,auVar9,0x50);
  if ((auVar9 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar9[0xf] < '\0')
  goto LAB_011386a7;
  bVar52 = 0;
  if ((auVar196._0_4_ < auVar240._0_4_) && (bVar52 = 0, auVar224._0_4_ < auVar149._0_4_)) {
    auVar92 = vmovshdup_avx(auVar240);
    auVar9 = vcmpps_avx(auVar224,auVar149,1);
    bVar52 = auVar9[4] & auVar273._0_4_ < auVar92._0_4_;
  }
  if (((3 < (uint)uVar54 || fVar86 < 0.001) | bVar52) != 1) goto LAB_0113953c;
  lVar51 = 0xc9;
  auVar227 = ZEXT464(0x40400000);
  do {
    lVar51 = lVar51 + -1;
    if (lVar51 == 0) goto LAB_011386a7;
    fVar166 = auVar272._0_4_;
    fVar89 = 1.0 - fVar166;
    fVar86 = fVar89 * fVar89 * fVar89;
    fVar88 = fVar166 * 3.0 * fVar89 * fVar89;
    fVar89 = fVar89 * fVar166 * fVar166 * 3.0;
    auVar144._4_4_ = fVar86;
    auVar144._0_4_ = fVar86;
    auVar144._8_4_ = fVar86;
    auVar144._12_4_ = fVar86;
    auVar122._4_4_ = fVar88;
    auVar122._0_4_ = fVar88;
    auVar122._8_4_ = fVar88;
    auVar122._12_4_ = fVar88;
    auVar105._4_4_ = fVar89;
    auVar105._0_4_ = fVar89;
    auVar105._8_4_ = fVar89;
    auVar105._12_4_ = fVar89;
    fVar166 = fVar166 * fVar166 * fVar166;
    auVar161._0_4_ = (float)local_3c0._0_4_ * fVar166;
    auVar161._4_4_ = (float)local_3c0._4_4_ * fVar166;
    auVar161._8_4_ = fStack_3b8 * fVar166;
    auVar161._12_4_ = fStack_3b4 * fVar166;
    auVar8 = vfmadd231ps_fma(auVar161,auVar13,auVar105);
    auVar8 = vfmadd231ps_fma(auVar8,auVar12,auVar122);
    auVar8 = vfmadd231ps_fma(auVar8,auVar11,auVar144);
    auVar106._8_8_ = auVar8._0_8_;
    auVar106._0_8_ = auVar8._0_8_;
    auVar8 = vshufpd_avx(auVar8,auVar8,3);
    auVar9 = vshufps_avx(auVar272,auVar272,0x55);
    auVar8 = vsubps_avx(auVar8,auVar106);
    auVar9 = vfmadd213ps_fma(auVar8,auVar9,auVar106);
    fVar86 = auVar9._0_4_;
    auVar8 = vshufps_avx(auVar9,auVar9,0x55);
    auVar107._0_4_ = fVar123 * fVar86 + fVar87 * auVar8._0_4_;
    auVar107._4_4_ = auVar131._4_4_ * fVar86 + auVar65._4_4_ * auVar8._4_4_;
    auVar107._8_4_ = auVar131._8_4_ * fVar86 + auVar65._8_4_ * auVar8._8_4_;
    auVar107._12_4_ = auVar131._12_4_ * fVar86 + auVar65._12_4_ * auVar8._12_4_;
    auVar272 = vsubps_avx(auVar272,auVar107);
    auVar8 = vandps_avx(auVar242,auVar9);
    auVar9 = vshufps_avx(auVar8,auVar8,0xf5);
    auVar8 = vmaxss_avx(auVar9,auVar8);
  } while ((float)local_3d0._0_4_ <= auVar8._0_4_);
  local_120 = auVar272._0_4_;
  if ((local_120 < 0.0) || (1.0 < local_120)) goto LAB_011386a7;
  auVar8 = vmovshdup_avx(auVar272);
  fVar86 = auVar8._0_4_;
  if ((fVar86 < 0.0) || (1.0 < fVar86)) goto LAB_011386a7;
  auVar9 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                         ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar244 = vinsertps_avx(auVar9,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar9 = vdpps_avx(auVar244,auVar63,0x7f);
  auVar131 = vdpps_avx(auVar244,auVar94,0x7f);
  auVar65 = vdpps_avx(auVar244,local_3e0,0x7f);
  auVar92 = vdpps_avx(auVar244,local_3f0,0x7f);
  auVar251 = vdpps_avx(auVar244,local_400,0x7f);
  auVar149 = vdpps_avx(auVar244,local_410,0x7f);
  auVar167 = vdpps_avx(auVar244,local_420,0x7f);
  auVar244 = vdpps_avx(auVar244,local_430,0x7f);
  fVar88 = 1.0 - fVar86;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * auVar251._0_4_)),ZEXT416((uint)fVar88),auVar9);
  auVar131 = vfmadd231ss_fma(ZEXT416((uint)(auVar149._0_4_ * fVar86)),ZEXT416((uint)fVar88),auVar131
                            );
  auVar227 = ZEXT1664(auVar131);
  auVar65 = vfmadd231ss_fma(ZEXT416((uint)(auVar167._0_4_ * fVar86)),ZEXT416((uint)fVar88),auVar65);
  auVar92 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * auVar244._0_4_)),ZEXT416((uint)fVar88),auVar92);
  fVar87 = 1.0 - local_120;
  fVar86 = fVar87 * local_120 * local_120 * 3.0;
  fVar166 = local_120 * local_120 * local_120;
  auVar65 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * auVar92._0_4_)),ZEXT416((uint)fVar86),auVar65);
  fVar88 = local_120 * 3.0 * fVar87 * fVar87;
  auVar131 = vfmadd231ss_fma(auVar65,ZEXT416((uint)fVar88),auVar131);
  fVar123 = fVar87 * fVar87 * fVar87;
  auVar9 = vfmadd231ss_fma(auVar131,ZEXT416((uint)fVar123),auVar9);
  fVar89 = auVar9._0_4_;
  if ((fVar89 < fVar60) || (fVar61 = *(float *)(ray + k * 4 + 0x100), fVar61 < fVar89))
  goto LAB_011386a7;
  pGVar4 = (context->scene->geometries).items[uVar48].ptr;
  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar52 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_011394d2;
    auVar9 = vshufps_avx(auVar272,auVar272,0x55);
    auVar225._8_4_ = 0x3f800000;
    auVar225._0_8_ = 0x3f8000003f800000;
    auVar225._12_4_ = 0x3f800000;
    auVar131 = vsubps_avx(auVar225,auVar9);
    fVar229 = auVar9._0_4_;
    auVar241._0_4_ = fVar229 * auVar232._0_4_;
    fVar269 = auVar9._4_4_;
    auVar241._4_4_ = fVar269 * auVar232._4_4_;
    fVar270 = auVar9._8_4_;
    auVar241._8_4_ = fVar270 * auVar232._8_4_;
    fVar271 = auVar9._12_4_;
    auVar241._12_4_ = fVar271 * auVar232._12_4_;
    auVar247._0_4_ = fVar229 * auVar67._0_4_;
    auVar247._4_4_ = fVar269 * auVar67._4_4_;
    auVar247._8_4_ = fVar270 * auVar67._8_4_;
    auVar247._12_4_ = fVar271 * auVar67._12_4_;
    local_5d0 = auVar124._0_4_;
    fStack_5cc = auVar124._4_4_;
    fStack_5c8 = auVar124._8_4_;
    fStack_5c4 = auVar124._12_4_;
    auVar255._0_4_ = fVar229 * local_5d0;
    auVar255._4_4_ = fVar269 * fStack_5cc;
    auVar255._8_4_ = fVar270 * fStack_5c8;
    auVar255._12_4_ = fVar271 * fStack_5c4;
    auVar207._0_4_ = fVar229 * fVar165;
    auVar207._4_4_ = fVar269 * fVar184;
    auVar207._8_4_ = fVar270 * fVar185;
    auVar207._12_4_ = fVar271 * fVar186;
    auVar9 = vfmadd231ps_fma(auVar241,auVar131,auVar64);
    auVar65 = vfmadd231ps_fma(auVar247,auVar131,auVar126);
    auVar92 = vfmadd231ps_fma(auVar255,auVar131,auVar93);
    auVar251 = vfmadd231ps_fma(auVar207,auVar131,auVar113);
    auVar131 = vsubps_avx(auVar65,auVar9);
    auVar227 = ZEXT1664(auVar131);
    auVar9 = vsubps_avx(auVar92,auVar65);
    auVar65 = vsubps_avx(auVar251,auVar92);
    auVar256._0_4_ = local_120 * auVar9._0_4_;
    auVar256._4_4_ = local_120 * auVar9._4_4_;
    auVar256._8_4_ = local_120 * auVar9._8_4_;
    auVar256._12_4_ = local_120 * auVar9._12_4_;
    auVar193._4_4_ = fVar87;
    auVar193._0_4_ = fVar87;
    auVar193._8_4_ = fVar87;
    auVar193._12_4_ = fVar87;
    auVar92 = vfmadd231ps_fma(auVar256,auVar193,auVar131);
    auVar208._0_4_ = local_120 * auVar65._0_4_;
    auVar208._4_4_ = local_120 * auVar65._4_4_;
    auVar208._8_4_ = local_120 * auVar65._8_4_;
    auVar208._12_4_ = local_120 * auVar65._12_4_;
    auVar9 = vfmadd231ps_fma(auVar208,auVar193,auVar9);
    auVar209._0_4_ = local_120 * auVar9._0_4_;
    auVar209._4_4_ = local_120 * auVar9._4_4_;
    auVar209._8_4_ = local_120 * auVar9._8_4_;
    auVar209._12_4_ = local_120 * auVar9._12_4_;
    auVar65 = vfmadd231ps_fma(auVar209,auVar193,auVar92);
    auVar182._0_4_ = fVar166 * (float)local_490._0_4_;
    auVar182._4_4_ = fVar166 * (float)local_490._4_4_;
    auVar182._8_4_ = fVar166 * fStack_488;
    auVar182._12_4_ = fVar166 * fStack_484;
    auVar134._4_4_ = fVar86;
    auVar134._0_4_ = fVar86;
    auVar134._8_4_ = fVar86;
    auVar134._12_4_ = fVar86;
    auVar9 = vfmadd132ps_fma(auVar134,auVar182,local_480);
    auVar162._4_4_ = fVar88;
    auVar162._0_4_ = fVar88;
    auVar162._8_4_ = fVar88;
    auVar162._12_4_ = fVar88;
    auVar9 = vfmadd132ps_fma(auVar162,auVar9,local_470);
    auVar135._0_4_ = auVar65._0_4_ * 3.0;
    auVar135._4_4_ = auVar65._4_4_ * 3.0;
    auVar135._8_4_ = auVar65._8_4_ * 3.0;
    auVar135._12_4_ = auVar65._12_4_ * 3.0;
    auVar145._4_4_ = fVar123;
    auVar145._0_4_ = fVar123;
    auVar145._8_4_ = fVar123;
    auVar145._12_4_ = fVar123;
    auVar65 = vfmadd132ps_fma(auVar145,auVar9,local_460);
    auVar9 = vshufps_avx(auVar135,auVar135,0xc9);
    auVar163._0_4_ = auVar65._0_4_ * auVar9._0_4_;
    auVar163._4_4_ = auVar65._4_4_ * auVar9._4_4_;
    auVar163._8_4_ = auVar65._8_4_ * auVar9._8_4_;
    auVar163._12_4_ = auVar65._12_4_ * auVar9._12_4_;
    auVar9 = vshufps_avx(auVar65,auVar65,0xc9);
    auVar65 = vfmsub231ps_fma(auVar163,auVar135,auVar9);
    auVar9 = vmovshdup_avx(auVar65);
    local_180 = auVar9._0_8_;
    uStack_178 = local_180;
    uStack_170 = local_180;
    uStack_168 = local_180;
    auVar9 = vshufps_avx(auVar65,auVar65,0xaa);
    local_160 = auVar9._0_8_;
    uStack_158 = local_160;
    uStack_150 = local_160;
    uStack_148 = local_160;
    local_140 = auVar65._0_4_;
    uStack_13c = local_140;
    uStack_138 = local_140;
    uStack_134 = local_140;
    uStack_130 = local_140;
    uStack_12c = local_140;
    uStack_128 = local_140;
    uStack_124 = local_140;
    fStack_11c = local_120;
    fStack_118 = local_120;
    fStack_114 = local_120;
    fStack_110 = local_120;
    fStack_10c = local_120;
    fStack_108 = local_120;
    fStack_104 = local_120;
    local_100 = auVar8._0_8_;
    uStack_f8 = local_100;
    uStack_f0 = local_100;
    uStack_e8 = local_100;
    local_e0 = CONCAT44(uStack_33c,local_340);
    uStack_d8 = CONCAT44(uStack_334,uStack_338);
    uStack_d0 = CONCAT44(uStack_32c,uStack_330);
    uStack_c8 = CONCAT44(uStack_324,uStack_328);
    local_c0._4_4_ = uStack_31c;
    local_c0._0_4_ = local_320;
    local_c0._8_4_ = uStack_318;
    local_c0._12_4_ = uStack_314;
    local_c0._16_4_ = uStack_310;
    local_c0._20_4_ = uStack_30c;
    local_c0._24_4_ = uStack_308;
    local_c0._28_4_ = uStack_304;
    vpcmpeqd_avx2(local_c0,local_c0);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = fVar89;
    local_4c0 = local_360;
    local_510.valid = (int *)local_4c0;
    local_510.geometryUserPtr = pGVar4->userPtr;
    local_510.context = context->user;
    local_510.ray = (RTCRayN *)ray;
    local_510.hit = (RTCHitN *)&local_180;
    local_510.N = 8;
    if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      auVar227 = ZEXT1664(auVar131);
      (*pGVar4->occlusionFilterN)(&local_510);
    }
    auVar82 = vpcmpeqd_avx2(local_4c0,_DAT_01f7b000);
    auVar82 = _DAT_01f7b020 & ~auVar82;
    if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar82 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar82 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar82 >> 0x7f,0) != '\0') ||
          (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar82 >> 0xbf,0) != '\0') ||
        (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar82[0x1f] < '\0')
    {
      p_Var5 = context->args->filter;
      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
        auVar227 = ZEXT1664(auVar227._0_16_);
        (*p_Var5)(&local_510);
      }
      auVar15 = vpcmpeqd_avx2(local_4c0,_DAT_01f7b000);
      auVar112._8_4_ = 0xff800000;
      auVar112._0_8_ = 0xff800000ff800000;
      auVar112._12_4_ = 0xff800000;
      auVar112._16_4_ = 0xff800000;
      auVar112._20_4_ = 0xff800000;
      auVar112._24_4_ = 0xff800000;
      auVar112._28_4_ = 0xff800000;
      auVar82 = vblendvps_avx(auVar112,*(undefined1 (*) [32])(local_510.ray + 0x100),auVar15);
      *(undefined1 (*) [32])(local_510.ray + 0x100) = auVar82;
      auVar82 = _DAT_01f7b020 & ~auVar15;
      if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar82 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar82 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar82 >> 0x7f,0) != '\0') ||
            (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar82 >> 0xbf,0) != '\0') ||
          (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar82[0x1f] < '\0') {
        bVar52 = 1;
        goto LAB_011394d2;
      }
    }
    *(float *)(ray + k * 4 + 0x100) = fVar61;
  }
  bVar52 = 0;
LAB_011394d2:
  bVar58 = (bool)(bVar58 | bVar52);
  goto LAB_011386a7;
LAB_0113953c:
  local_440 = vinsertps_avx(auVar8,ZEXT416((uint)fVar88),0x10);
  auVar69 = vinsertps_avx(auVar273,ZEXT416((uint)auVar69._0_4_),0x10);
  goto LAB_011380f7;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }